

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx2::CurveNiMBIntersectorK<8,4>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx2::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  undefined1 (*pauVar2) [32];
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Primitive PVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  __int_type_conflict _Var16;
  long lVar17;
  RTCFilterFunctionN p_Var18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  bool bVar87;
  undefined1 auVar88 [32];
  bool bVar89;
  undefined1 auVar90 [32];
  bool bVar91;
  bool bVar92;
  bool bVar93;
  bool bVar94;
  bool bVar95;
  bool bVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [28];
  uint uVar115;
  uint uVar116;
  ulong uVar117;
  uint uVar118;
  ulong uVar119;
  long lVar120;
  long lVar121;
  Geometry *pGVar122;
  undefined4 uVar123;
  undefined8 uVar124;
  float fVar139;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar138;
  float fVar140;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar161;
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 extraout_var [56];
  float fVar162;
  float fVar164;
  undefined4 uVar165;
  float fVar184;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar163;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar187 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [64];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 in_ZMM10 [64];
  float fVar226;
  float fVar227;
  float fVar228;
  undefined1 auVar225 [32];
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar235;
  undefined1 auVar232 [16];
  undefined8 uVar236;
  undefined8 uVar237;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined8 uVar238;
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar242 [64];
  undefined1 auVar241 [32];
  undefined1 auVar243 [64];
  float fVar244;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  undefined1 auVar245 [32];
  undefined1 auVar246 [64];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  Precalculations *local_868;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  RTCFilterFunctionNArguments local_7b0;
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined1 local_750 [16];
  undefined1 local_740 [16];
  undefined1 (*local_728) [16];
  undefined1 local_720 [32];
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  LinearSpace3fa *local_5d0;
  Primitive *local_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  RTCHitN local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined1 local_3f0 [16];
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  int local_360;
  int local_35c;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined1 local_300 [32];
  float local_2e0 [4];
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  uint local_210;
  uint uStack_20c;
  uint uStack_208;
  uint uStack_204;
  uint local_200;
  uint uStack_1fc;
  uint uStack_1f8;
  uint uStack_1f4;
  undefined4 local_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [32];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar12 = prim[1];
  uVar117 = (ulong)(byte)PVar12;
  lVar22 = uVar117 * 0x25;
  auVar194 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar194 = vinsertps_avx(auVar194,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar187 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar187 = vinsertps_avx(auVar187,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar164 = *(float *)(prim + lVar22 + 0x12);
  auVar194 = vsubps_avx(auVar194,*(undefined1 (*) [16])(prim + lVar22 + 6));
  auVar125._0_4_ = fVar164 * auVar194._0_4_;
  auVar125._4_4_ = fVar164 * auVar194._4_4_;
  auVar125._8_4_ = fVar164 * auVar194._8_4_;
  auVar125._12_4_ = fVar164 * auVar194._12_4_;
  auVar166._0_4_ = fVar164 * auVar187._0_4_;
  auVar166._4_4_ = fVar164 * auVar187._4_4_;
  auVar166._8_4_ = fVar164 * auVar187._8_4_;
  auVar166._12_4_ = fVar164 * auVar187._12_4_;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *(ulong *)(prim + uVar117 * 4 + 6);
  auVar147 = vpmovsxbd_avx2(auVar194);
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar187._8_8_ = 0;
  auVar187._0_8_ = *(ulong *)(prim + uVar117 * 5 + 6);
  auVar20 = vpmovsxbd_avx2(auVar187);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar117 * 6 + 6);
  auVar133 = vpmovsxbd_avx2(auVar6);
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar117 * 0xf + 6);
  auVar135 = vpmovsxbd_avx2(auVar7);
  auVar135 = vcvtdq2ps_avx(auVar135);
  auVar207._8_8_ = 0;
  auVar207._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + 6);
  auVar181 = vpmovsxbd_avx2(auVar207);
  auVar181 = vcvtdq2ps_avx(auVar181);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar12 * 0x10 + uVar117 + 6);
  auVar221 = vpmovsxbd_avx2(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar117 * 0x1a + 6);
  auVar213 = vpmovsxbd_avx2(auVar9);
  auVar221 = vcvtdq2ps_avx(auVar221);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar117 * 0x1b + 6);
  auVar21 = vpmovsxbd_avx2(auVar10);
  auVar213 = vcvtdq2ps_avx(auVar213);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar117 * 0x1c + 6);
  auVar180 = vpmovsxbd_avx2(auVar11);
  auVar19 = vcvtdq2ps_avx(auVar21);
  auVar180 = vcvtdq2ps_avx(auVar180);
  auVar239._4_4_ = auVar166._0_4_;
  auVar239._0_4_ = auVar166._0_4_;
  auVar239._8_4_ = auVar166._0_4_;
  auVar239._12_4_ = auVar166._0_4_;
  auVar239._16_4_ = auVar166._0_4_;
  auVar239._20_4_ = auVar166._0_4_;
  auVar239._24_4_ = auVar166._0_4_;
  auVar239._28_4_ = auVar166._0_4_;
  auVar194 = vmovshdup_avx(auVar166);
  uVar124 = auVar194._0_8_;
  auVar253._8_8_ = uVar124;
  auVar253._0_8_ = uVar124;
  auVar253._16_8_ = uVar124;
  auVar253._24_8_ = uVar124;
  auVar194 = vshufps_avx(auVar166,auVar166,0xaa);
  fVar164 = auVar194._0_4_;
  auVar242._0_4_ = fVar164 * auVar133._0_4_;
  fVar163 = auVar194._4_4_;
  auVar242._4_4_ = fVar163 * auVar133._4_4_;
  auVar242._8_4_ = fVar164 * auVar133._8_4_;
  auVar242._12_4_ = fVar163 * auVar133._12_4_;
  auVar242._16_4_ = fVar164 * auVar133._16_4_;
  auVar242._20_4_ = fVar163 * auVar133._20_4_;
  auVar242._28_36_ = in_ZMM10._28_36_;
  auVar242._24_4_ = fVar164 * auVar133._24_4_;
  auVar156._4_4_ = auVar221._4_4_ * fVar163;
  auVar156._0_4_ = auVar221._0_4_ * fVar164;
  auVar156._8_4_ = auVar221._8_4_ * fVar164;
  auVar156._12_4_ = auVar221._12_4_ * fVar163;
  auVar156._16_4_ = auVar221._16_4_ * fVar164;
  auVar156._20_4_ = auVar221._20_4_ * fVar163;
  auVar156._24_4_ = auVar221._24_4_ * fVar164;
  auVar156._28_4_ = auVar21._28_4_;
  auVar210._0_4_ = auVar180._0_4_ * fVar164;
  auVar210._4_4_ = auVar180._4_4_ * fVar163;
  auVar210._8_4_ = auVar180._8_4_ * fVar164;
  auVar210._12_4_ = auVar180._12_4_ * fVar163;
  auVar210._16_4_ = auVar180._16_4_ * fVar164;
  auVar210._20_4_ = auVar180._20_4_ * fVar163;
  auVar210._24_4_ = auVar180._24_4_ * fVar164;
  auVar210._28_4_ = 0;
  auVar194 = vfmadd231ps_fma(auVar242._0_32_,auVar253,auVar20);
  auVar187 = vfmadd231ps_fma(auVar156,auVar253,auVar181);
  auVar6 = vfmadd231ps_fma(auVar210,auVar19,auVar253);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar194),auVar239,auVar147);
  auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar239,auVar135);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar213,auVar239);
  auVar240._4_4_ = auVar125._0_4_;
  auVar240._0_4_ = auVar125._0_4_;
  auVar240._8_4_ = auVar125._0_4_;
  auVar240._12_4_ = auVar125._0_4_;
  auVar240._16_4_ = auVar125._0_4_;
  auVar240._20_4_ = auVar125._0_4_;
  auVar240._24_4_ = auVar125._0_4_;
  auVar240._28_4_ = auVar125._0_4_;
  auVar194 = vmovshdup_avx(auVar125);
  uVar124 = auVar194._0_8_;
  auVar254._8_8_ = uVar124;
  auVar254._0_8_ = uVar124;
  auVar254._16_8_ = uVar124;
  auVar254._24_8_ = uVar124;
  auVar194 = vshufps_avx(auVar125,auVar125,0xaa);
  fVar164 = auVar194._0_4_;
  auVar149._0_4_ = fVar164 * auVar133._0_4_;
  fVar163 = auVar194._4_4_;
  auVar149._4_4_ = fVar163 * auVar133._4_4_;
  auVar149._8_4_ = fVar164 * auVar133._8_4_;
  auVar149._12_4_ = fVar163 * auVar133._12_4_;
  auVar149._16_4_ = fVar164 * auVar133._16_4_;
  auVar149._20_4_ = fVar163 * auVar133._20_4_;
  auVar149._24_4_ = fVar164 * auVar133._24_4_;
  auVar149._28_4_ = 0;
  auVar21._4_4_ = auVar221._4_4_ * fVar163;
  auVar21._0_4_ = auVar221._0_4_ * fVar164;
  auVar21._8_4_ = auVar221._8_4_ * fVar164;
  auVar21._12_4_ = auVar221._12_4_ * fVar163;
  auVar21._16_4_ = auVar221._16_4_ * fVar164;
  auVar21._20_4_ = auVar221._20_4_ * fVar163;
  auVar21._24_4_ = auVar221._24_4_ * fVar164;
  auVar21._28_4_ = auVar133._28_4_;
  auVar133._4_4_ = auVar180._4_4_ * fVar163;
  auVar133._0_4_ = auVar180._0_4_ * fVar164;
  auVar133._8_4_ = auVar180._8_4_ * fVar164;
  auVar133._12_4_ = auVar180._12_4_ * fVar163;
  auVar133._16_4_ = auVar180._16_4_ * fVar164;
  auVar133._20_4_ = auVar180._20_4_ * fVar163;
  auVar133._24_4_ = auVar180._24_4_ * fVar164;
  auVar133._28_4_ = fVar163;
  auVar194 = vfmadd231ps_fma(auVar149,auVar254,auVar20);
  auVar207 = vfmadd231ps_fma(auVar21,auVar254,auVar181);
  auVar8 = vfmadd231ps_fma(auVar133,auVar254,auVar19);
  auVar125 = vfmadd231ps_fma(ZEXT1632(auVar194),auVar240,auVar147);
  local_1e0._8_4_ = 0x7fffffff;
  local_1e0._0_8_ = 0x7fffffff7fffffff;
  local_1e0._12_4_ = 0x7fffffff;
  local_1e0._16_4_ = 0x7fffffff;
  local_1e0._20_4_ = 0x7fffffff;
  local_1e0._24_4_ = 0x7fffffff;
  local_1e0._28_4_ = 0x7fffffff;
  auVar188._8_4_ = 0x219392ef;
  auVar188._0_8_ = 0x219392ef219392ef;
  auVar188._12_4_ = 0x219392ef;
  auVar188._16_4_ = 0x219392ef;
  auVar188._20_4_ = 0x219392ef;
  auVar188._24_4_ = 0x219392ef;
  auVar188._28_4_ = 0x219392ef;
  auVar147 = vandps_avx(ZEXT1632(auVar7),local_1e0);
  auVar147 = vcmpps_avx(auVar147,auVar188,1);
  auVar20 = vblendvps_avx(ZEXT1632(auVar7),auVar188,auVar147);
  auVar147 = vandps_avx(ZEXT1632(auVar187),local_1e0);
  auVar147 = vcmpps_avx(auVar147,auVar188,1);
  auVar133 = vblendvps_avx(ZEXT1632(auVar187),auVar188,auVar147);
  auVar147 = vandps_avx(ZEXT1632(auVar6),local_1e0);
  auVar147 = vcmpps_avx(auVar147,auVar188,1);
  auVar147 = vblendvps_avx(ZEXT1632(auVar6),auVar188,auVar147);
  auVar166 = vfmadd231ps_fma(ZEXT1632(auVar207),auVar240,auVar135);
  auVar135 = vrcpps_avx(auVar20);
  auVar23 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar240,auVar213);
  auVar211._8_4_ = 0x3f800000;
  auVar211._0_8_ = &DAT_3f8000003f800000;
  auVar211._12_4_ = 0x3f800000;
  auVar211._16_4_ = 0x3f800000;
  auVar211._20_4_ = 0x3f800000;
  auVar211._24_4_ = 0x3f800000;
  auVar211._28_4_ = 0x3f800000;
  auVar194 = vfnmadd213ps_fma(auVar20,auVar135,auVar211);
  auVar194 = vfmadd132ps_fma(ZEXT1632(auVar194),auVar135,auVar135);
  auVar20 = vrcpps_avx(auVar133);
  auVar187 = vfnmadd213ps_fma(auVar133,auVar20,auVar211);
  auVar133 = vrcpps_avx(auVar147);
  auVar187 = vfmadd132ps_fma(ZEXT1632(auVar187),auVar20,auVar20);
  auVar6 = vfnmadd213ps_fma(auVar147,auVar133,auVar211);
  auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar133,auVar133);
  fVar164 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar22 + 0x16)) *
            *(float *)(prim + lVar22 + 0x1a);
  auVar147 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar117 * 7 + 6));
  auVar205._4_4_ = fVar164;
  auVar205._0_4_ = fVar164;
  auVar205._8_4_ = fVar164;
  auVar205._12_4_ = fVar164;
  auVar205._16_4_ = fVar164;
  auVar205._20_4_ = fVar164;
  auVar205._24_4_ = fVar164;
  auVar205._28_4_ = fVar164;
  auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar117 * 0xb + 6));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar147);
  auVar7 = vfmadd213ps_fma(auVar20,auVar205,auVar147);
  auVar147 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar117 * 9 + 6));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar117 * 0xd + 6));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar147);
  auVar207 = vfmadd213ps_fma(auVar20,auVar205,auVar147);
  auVar147 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar117 * 0x12 + 6));
  uVar119 = (ulong)(uint)((int)(uVar117 * 5) << 2);
  auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar117 * 2 + uVar119 + 6));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar147);
  auVar8 = vfmadd213ps_fma(auVar20,auVar205,auVar147);
  auVar147 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar119 + 6));
  auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar117 * 0x18 + 6));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar147);
  auVar9 = vfmadd213ps_fma(auVar20,auVar205,auVar147);
  auVar147 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar117 * 0x1d + 6));
  auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar117 + (ulong)(byte)PVar12 * 0x20 + 6));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar147);
  auVar10 = vfmadd213ps_fma(auVar20,auVar205,auVar147);
  auVar147 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + ((ulong)(byte)PVar12 * 0x20 - uVar117) + 6));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar117 * 0x23 + 6));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar20 = vsubps_avx(auVar20,auVar147);
  auVar11 = vfmadd213ps_fma(auVar20,auVar205,auVar147);
  auVar147 = vsubps_avx(ZEXT1632(auVar7),ZEXT1632(auVar125));
  auVar135._4_4_ = auVar194._4_4_ * auVar147._4_4_;
  auVar135._0_4_ = auVar194._0_4_ * auVar147._0_4_;
  auVar135._8_4_ = auVar194._8_4_ * auVar147._8_4_;
  auVar135._12_4_ = auVar194._12_4_ * auVar147._12_4_;
  auVar135._16_4_ = auVar147._16_4_ * 0.0;
  auVar135._20_4_ = auVar147._20_4_ * 0.0;
  auVar135._24_4_ = auVar147._24_4_ * 0.0;
  auVar135._28_4_ = auVar147._28_4_;
  auVar147 = vsubps_avx(ZEXT1632(auVar207),ZEXT1632(auVar125));
  auVar181._4_4_ = auVar194._4_4_ * auVar147._4_4_;
  auVar181._0_4_ = auVar194._0_4_ * auVar147._0_4_;
  auVar181._8_4_ = auVar194._8_4_ * auVar147._8_4_;
  auVar181._12_4_ = auVar194._12_4_ * auVar147._12_4_;
  auVar181._16_4_ = auVar147._16_4_ * 0.0;
  auVar181._20_4_ = auVar147._20_4_ * 0.0;
  auVar181._24_4_ = auVar147._24_4_ * 0.0;
  auVar181._28_4_ = auVar147._28_4_;
  auVar147 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar166));
  auVar221._4_4_ = auVar187._4_4_ * auVar147._4_4_;
  auVar221._0_4_ = auVar187._0_4_ * auVar147._0_4_;
  auVar221._8_4_ = auVar187._8_4_ * auVar147._8_4_;
  auVar221._12_4_ = auVar187._12_4_ * auVar147._12_4_;
  auVar221._16_4_ = auVar147._16_4_ * 0.0;
  auVar221._20_4_ = auVar147._20_4_ * 0.0;
  auVar221._24_4_ = auVar147._24_4_ * 0.0;
  auVar221._28_4_ = auVar147._28_4_;
  auVar147 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar166));
  auVar213._4_4_ = auVar187._4_4_ * auVar147._4_4_;
  auVar213._0_4_ = auVar187._0_4_ * auVar147._0_4_;
  auVar213._8_4_ = auVar187._8_4_ * auVar147._8_4_;
  auVar213._12_4_ = auVar187._12_4_ * auVar147._12_4_;
  auVar213._16_4_ = auVar147._16_4_ * 0.0;
  auVar213._20_4_ = auVar147._20_4_ * 0.0;
  auVar213._24_4_ = auVar147._24_4_ * 0.0;
  auVar213._28_4_ = auVar147._28_4_;
  auVar147 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar23));
  auVar19._4_4_ = auVar6._4_4_ * auVar147._4_4_;
  auVar19._0_4_ = auVar6._0_4_ * auVar147._0_4_;
  auVar19._8_4_ = auVar6._8_4_ * auVar147._8_4_;
  auVar19._12_4_ = auVar6._12_4_ * auVar147._12_4_;
  auVar19._16_4_ = auVar147._16_4_ * 0.0;
  auVar19._20_4_ = auVar147._20_4_ * 0.0;
  auVar19._24_4_ = auVar147._24_4_ * 0.0;
  auVar19._28_4_ = auVar147._28_4_;
  auVar147 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar23));
  auVar180._4_4_ = auVar6._4_4_ * auVar147._4_4_;
  auVar180._0_4_ = auVar6._0_4_ * auVar147._0_4_;
  auVar180._8_4_ = auVar6._8_4_ * auVar147._8_4_;
  auVar180._12_4_ = auVar6._12_4_ * auVar147._12_4_;
  auVar180._16_4_ = auVar147._16_4_ * 0.0;
  auVar180._20_4_ = auVar147._20_4_ * 0.0;
  auVar180._24_4_ = auVar147._24_4_ * 0.0;
  auVar180._28_4_ = auVar147._28_4_;
  auVar147 = vpminsd_avx2(auVar135,auVar181);
  auVar20 = vpminsd_avx2(auVar221,auVar213);
  auVar147 = vmaxps_avx(auVar147,auVar20);
  auVar20 = vpminsd_avx2(auVar19,auVar180);
  uVar123 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar212._4_4_ = uVar123;
  auVar212._0_4_ = uVar123;
  auVar212._8_4_ = uVar123;
  auVar212._12_4_ = uVar123;
  auVar212._16_4_ = uVar123;
  auVar212._20_4_ = uVar123;
  auVar212._24_4_ = uVar123;
  auVar212._28_4_ = uVar123;
  auVar20 = vmaxps_avx(auVar20,auVar212);
  auVar147 = vmaxps_avx(auVar147,auVar20);
  local_80._4_4_ = auVar147._4_4_ * 0.99999964;
  local_80._0_4_ = auVar147._0_4_ * 0.99999964;
  local_80._8_4_ = auVar147._8_4_ * 0.99999964;
  local_80._12_4_ = auVar147._12_4_ * 0.99999964;
  local_80._16_4_ = auVar147._16_4_ * 0.99999964;
  local_80._20_4_ = auVar147._20_4_ * 0.99999964;
  local_80._24_4_ = auVar147._24_4_ * 0.99999964;
  local_80._28_4_ = auVar147._28_4_;
  auVar147 = vpmaxsd_avx2(auVar135,auVar181);
  auVar20 = vpmaxsd_avx2(auVar221,auVar213);
  auVar147 = vminps_avx(auVar147,auVar20);
  auVar20 = vpmaxsd_avx2(auVar19,auVar180);
  uVar123 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar177._4_4_ = uVar123;
  auVar177._0_4_ = uVar123;
  auVar177._8_4_ = uVar123;
  auVar177._12_4_ = uVar123;
  auVar177._16_4_ = uVar123;
  auVar177._20_4_ = uVar123;
  auVar177._24_4_ = uVar123;
  auVar177._28_4_ = uVar123;
  auVar20 = vminps_avx(auVar20,auVar177);
  auVar147 = vminps_avx(auVar147,auVar20);
  auVar127._4_4_ = auVar147._4_4_ * 1.0000004;
  auVar127._0_4_ = auVar147._0_4_ * 1.0000004;
  auVar127._8_4_ = auVar147._8_4_ * 1.0000004;
  auVar127._12_4_ = auVar147._12_4_ * 1.0000004;
  auVar127._16_4_ = auVar147._16_4_ * 1.0000004;
  auVar127._20_4_ = auVar147._20_4_ * 1.0000004;
  auVar127._24_4_ = auVar147._24_4_ * 1.0000004;
  auVar127._28_4_ = auVar147._28_4_;
  auVar147._1_3_ = 0;
  auVar147[0] = PVar12;
  auVar147[4] = PVar12;
  auVar147._5_3_ = 0;
  auVar147[8] = PVar12;
  auVar147._9_3_ = 0;
  auVar147[0xc] = PVar12;
  auVar147._13_3_ = 0;
  auVar147[0x10] = PVar12;
  auVar147._17_3_ = 0;
  auVar147[0x14] = PVar12;
  auVar147._21_3_ = 0;
  auVar147[0x18] = PVar12;
  auVar147._25_3_ = 0;
  auVar147[0x1c] = PVar12;
  auVar147._29_3_ = 0;
  auVar20 = vpcmpgtd_avx2(auVar147,_DAT_0205a920);
  auVar147 = vcmpps_avx(local_80,auVar127,2);
  auVar147 = vandps_avx(auVar147,auVar20);
  uVar115 = vmovmskps_avx(auVar147);
  if (uVar115 != 0) {
    uVar115 = uVar115 & 0xff;
    local_5c0 = mm_lookupmask_ps._16_8_;
    uStack_5b8 = mm_lookupmask_ps._24_8_;
    uStack_5b0 = mm_lookupmask_ps._16_8_;
    uStack_5a8 = mm_lookupmask_ps._24_8_;
    local_5d0 = pre->ray_space + k;
    local_728 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
    local_1f0 = 0x7fffffff;
    uStack_1ec = 0x7fffffff;
    uStack_1e8 = 0x7fffffff;
    uStack_1e4 = 0x7fffffff;
    local_868 = pre;
    local_5c8 = prim;
    do {
      auVar147 = local_580;
      lVar22 = 0;
      for (uVar117 = (ulong)uVar115; (uVar117 & 1) == 0; uVar117 = uVar117 >> 1 | 0x8000000000000000
          ) {
        lVar22 = lVar22 + 1;
      }
      uVar13 = *(uint *)(local_5c8 + 2);
      uVar14 = *(uint *)(local_5c8 + lVar22 * 4 + 6);
      pGVar122 = (context->scene->geometries).items[uVar13].ptr;
      uVar117 = (ulong)*(uint *)(*(long *)&pGVar122->field_0x58 +
                                (ulong)uVar14 *
                                pGVar122[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar164 = (pGVar122->time_range).lower;
      fVar164 = pGVar122->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar164) /
                ((pGVar122->time_range).upper - fVar164));
      auVar194 = vroundss_avx(ZEXT416((uint)fVar164),ZEXT416((uint)fVar164),9);
      auVar194 = vminss_avx(auVar194,ZEXT416((uint)(pGVar122->fnumTimeSegments + -1.0)));
      auVar194 = vmaxss_avx(ZEXT816(0) << 0x20,auVar194);
      fVar164 = fVar164 - auVar194._0_4_;
      _Var16 = pGVar122[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar121 = (long)(int)auVar194._0_4_ * 0x38;
      lVar22 = *(long *)(_Var16 + 0x10 + lVar121);
      lVar120 = *(long *)(_Var16 + 0x38 + lVar121);
      lVar17 = *(long *)(_Var16 + 0x48 + lVar121);
      pfVar1 = (float *)(lVar120 + uVar117 * lVar17);
      auVar191._0_4_ = fVar164 * *pfVar1;
      auVar191._4_4_ = fVar164 * pfVar1[1];
      auVar191._8_4_ = fVar164 * pfVar1[2];
      auVar191._12_4_ = fVar164 * pfVar1[3];
      pfVar1 = (float *)(lVar120 + (uVar117 + 1) * lVar17);
      auVar223._0_4_ = fVar164 * *pfVar1;
      auVar223._4_4_ = fVar164 * pfVar1[1];
      auVar223._8_4_ = fVar164 * pfVar1[2];
      auVar223._12_4_ = fVar164 * pfVar1[3];
      pfVar1 = (float *)(lVar120 + (uVar117 + 2) * lVar17);
      auVar167._0_4_ = fVar164 * *pfVar1;
      auVar167._4_4_ = fVar164 * pfVar1[1];
      auVar167._8_4_ = fVar164 * pfVar1[2];
      auVar167._12_4_ = fVar164 * pfVar1[3];
      pfVar1 = (float *)(lVar120 + lVar17 * (uVar117 + 3));
      auVar185._0_4_ = fVar164 * *pfVar1;
      auVar185._4_4_ = fVar164 * pfVar1[1];
      auVar185._8_4_ = fVar164 * pfVar1[2];
      auVar185._12_4_ = fVar164 * pfVar1[3];
      lVar120 = *(long *)(_Var16 + lVar121);
      fVar164 = 1.0 - fVar164;
      auVar126._4_4_ = fVar164;
      auVar126._0_4_ = fVar164;
      auVar126._8_4_ = fVar164;
      auVar126._12_4_ = fVar164;
      auVar8 = vfmadd231ps_fma(auVar191,auVar126,*(undefined1 (*) [16])(lVar120 + lVar22 * uVar117))
      ;
      local_740 = vfmadd231ps_fma(auVar223,auVar126,
                                  *(undefined1 (*) [16])(lVar120 + lVar22 * (uVar117 + 1)));
      local_750 = vfmadd231ps_fma(auVar167,auVar126,
                                  *(undefined1 (*) [16])(lVar120 + lVar22 * (uVar117 + 2)));
      _local_760 = vfmadd231ps_fma(auVar185,auVar126,
                                   *(undefined1 (*) [16])(lVar120 + lVar22 * (uVar117 + 3)));
      iVar15 = (int)pGVar122[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar22 = (long)iVar15 * 0x44;
      auVar194 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar7 = vinsertps_avx(auVar194,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar187 = vsubps_avx(auVar8,auVar7);
      uVar123 = auVar187._0_4_;
      auVar168._4_4_ = uVar123;
      auVar168._0_4_ = uVar123;
      auVar168._8_4_ = uVar123;
      auVar168._12_4_ = uVar123;
      auVar194 = vshufps_avx(auVar187,auVar187,0x55);
      auVar187 = vshufps_avx(auVar187,auVar187,0xaa);
      aVar4 = (local_5d0->vx).field_0;
      aVar5 = (local_5d0->vy).field_0;
      fVar164 = (local_5d0->vz).field_0.m128[0];
      fVar163 = (local_5d0->vz).field_0.m128[1];
      fVar138 = (local_5d0->vz).field_0.m128[2];
      fVar139 = (local_5d0->vz).field_0.m128[3];
      auVar216._0_4_ = fVar164 * auVar187._0_4_;
      auVar216._4_4_ = fVar163 * auVar187._4_4_;
      auVar216._8_4_ = fVar138 * auVar187._8_4_;
      auVar216._12_4_ = fVar139 * auVar187._12_4_;
      auVar194 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar5,auVar194);
      auVar9 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar4,auVar168);
      auVar194 = vblendps_avx(auVar9,auVar8,8);
      auVar6 = vsubps_avx(local_740,auVar7);
      uVar123 = auVar6._0_4_;
      auVar186._4_4_ = uVar123;
      auVar186._0_4_ = uVar123;
      auVar186._8_4_ = uVar123;
      auVar186._12_4_ = uVar123;
      auVar187 = vshufps_avx(auVar6,auVar6,0x55);
      auVar6 = vshufps_avx(auVar6,auVar6,0xaa);
      auVar217._0_4_ = fVar164 * auVar6._0_4_;
      auVar217._4_4_ = fVar163 * auVar6._4_4_;
      auVar217._8_4_ = fVar138 * auVar6._8_4_;
      auVar217._12_4_ = fVar139 * auVar6._12_4_;
      auVar187 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar5,auVar187);
      auVar10 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar4,auVar186);
      auVar187 = vblendps_avx(auVar10,local_740,8);
      auVar207 = vsubps_avx(local_750,auVar7);
      uVar123 = auVar207._0_4_;
      auVar208._4_4_ = uVar123;
      auVar208._0_4_ = uVar123;
      auVar208._8_4_ = uVar123;
      auVar208._12_4_ = uVar123;
      auVar6 = vshufps_avx(auVar207,auVar207,0x55);
      auVar207 = vshufps_avx(auVar207,auVar207,0xaa);
      auVar218._0_4_ = fVar164 * auVar207._0_4_;
      auVar218._4_4_ = fVar163 * auVar207._4_4_;
      auVar218._8_4_ = fVar138 * auVar207._8_4_;
      auVar218._12_4_ = fVar139 * auVar207._12_4_;
      auVar6 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar5,auVar6);
      auVar11 = vfmadd231ps_fma(auVar6,(undefined1  [16])aVar4,auVar208);
      auVar6 = vblendps_avx(auVar11,local_750,8);
      auVar207 = vsubps_avx(_local_760,auVar7);
      uVar123 = auVar207._0_4_;
      auVar209._4_4_ = uVar123;
      auVar209._0_4_ = uVar123;
      auVar209._8_4_ = uVar123;
      auVar209._12_4_ = uVar123;
      auVar7 = vshufps_avx(auVar207,auVar207,0x55);
      auVar207 = vshufps_avx(auVar207,auVar207,0xaa);
      auVar232._0_4_ = fVar164 * auVar207._0_4_;
      auVar232._4_4_ = fVar163 * auVar207._4_4_;
      auVar232._8_4_ = fVar138 * auVar207._8_4_;
      auVar232._12_4_ = fVar139 * auVar207._12_4_;
      auVar7 = vfmadd231ps_fma(auVar232,(undefined1  [16])aVar5,auVar7);
      auVar125 = vfmadd231ps_fma(auVar7,(undefined1  [16])aVar4,auVar209);
      auVar7 = vblendps_avx(auVar125,_local_760,8);
      auVar23._4_4_ = uStack_1ec;
      auVar23._0_4_ = local_1f0;
      auVar23._8_4_ = uStack_1e8;
      auVar23._12_4_ = uStack_1e4;
      auVar194 = vandps_avx(auVar194,auVar23);
      auVar187 = vandps_avx(auVar187,auVar23);
      auVar207 = vmaxps_avx(auVar194,auVar187);
      auVar194 = vandps_avx(auVar6,auVar23);
      auVar187 = vandps_avx(auVar7,auVar23);
      auVar194 = vmaxps_avx(auVar194,auVar187);
      auVar194 = vmaxps_avx(auVar207,auVar194);
      auVar187 = vmovshdup_avx(auVar194);
      auVar187 = vmaxss_avx(auVar187,auVar194);
      auVar194 = vshufpd_avx(auVar194,auVar194,1);
      auVar194 = vmaxss_avx(auVar194,auVar187);
      auVar187 = vmovshdup_avx(auVar9);
      uVar124 = auVar187._0_8_;
      local_4c0._8_8_ = uVar124;
      local_4c0._0_8_ = uVar124;
      local_4c0._16_8_ = uVar124;
      local_4c0._24_8_ = uVar124;
      auVar187 = vmovshdup_avx(auVar10);
      uVar124 = auVar187._0_8_;
      local_4a0._8_8_ = uVar124;
      local_4a0._0_8_ = uVar124;
      local_4a0._16_8_ = uVar124;
      local_4a0._24_8_ = uVar124;
      auVar20 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x908);
      uVar165 = auVar11._0_4_;
      local_6e0._4_4_ = uVar165;
      local_6e0._0_4_ = uVar165;
      local_6e0._8_4_ = uVar165;
      local_6e0._12_4_ = uVar165;
      local_6e0._16_4_ = uVar165;
      local_6e0._20_4_ = uVar165;
      local_6e0._24_4_ = uVar165;
      local_6e0._28_4_ = uVar165;
      auVar187 = vmovshdup_avx(auVar11);
      uVar124 = auVar187._0_8_;
      local_800._8_8_ = uVar124;
      local_800._0_8_ = uVar124;
      local_800._16_8_ = uVar124;
      local_800._24_8_ = uVar124;
      fVar164 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar22 + 0xd8c);
      auVar114 = *(undefined1 (*) [28])(bspline_basis0 + lVar22 + 0xd8c);
      auVar187 = vmovshdup_avx(auVar125);
      local_820 = auVar187._0_8_;
      fVar230 = auVar125._0_4_;
      auVar148._0_4_ = fVar230 * fVar164;
      auVar148._4_4_ = fVar230 * *(float *)(bspline_basis0 + lVar22 + 0xd90);
      auVar148._8_4_ = fVar230 * *(float *)(bspline_basis0 + lVar22 + 0xd94);
      auVar148._12_4_ = fVar230 * *(float *)(bspline_basis0 + lVar22 + 0xd98);
      auVar148._16_4_ = fVar230 * *(float *)(bspline_basis0 + lVar22 + 0xd9c);
      auVar148._20_4_ = fVar230 * *(float *)(bspline_basis0 + lVar22 + 0xda0);
      auVar148._24_4_ = fVar230 * *(float *)(bspline_basis0 + lVar22 + 0xda4);
      auVar148._28_4_ = 0;
      auVar6 = vfmadd231ps_fma(auVar148,auVar20,local_6e0);
      fVar162 = auVar187._0_4_;
      fVar184 = auVar187._4_4_;
      auVar24._4_4_ = fVar184 * *(float *)(bspline_basis0 + lVar22 + 0xd90);
      auVar24._0_4_ = fVar162 * fVar164;
      auVar24._8_4_ = fVar162 * *(float *)(bspline_basis0 + lVar22 + 0xd94);
      auVar24._12_4_ = fVar184 * *(float *)(bspline_basis0 + lVar22 + 0xd98);
      auVar24._16_4_ = fVar162 * *(float *)(bspline_basis0 + lVar22 + 0xd9c);
      auVar24._20_4_ = fVar184 * *(float *)(bspline_basis0 + lVar22 + 0xda0);
      auVar24._24_4_ = fVar162 * *(float *)(bspline_basis0 + lVar22 + 0xda4);
      auVar24._28_4_ = *(undefined4 *)(bspline_basis0 + lVar22 + 0xda8);
      auVar187 = vfmadd231ps_fma(auVar24,auVar20,local_800);
      auVar133 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x484);
      uVar123 = auVar10._0_4_;
      local_840._4_4_ = uVar123;
      local_840._0_4_ = uVar123;
      local_840._8_4_ = uVar123;
      local_840._12_4_ = uVar123;
      local_840._16_4_ = uVar123;
      local_840._20_4_ = uVar123;
      local_840._24_4_ = uVar123;
      local_840._28_4_ = uVar123;
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar133,local_840);
      auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar133,local_4a0);
      auVar135 = *(undefined1 (*) [32])(bspline_basis0 + lVar22);
      uVar123 = auVar9._0_4_;
      local_7e0._4_4_ = uVar123;
      local_7e0._0_4_ = uVar123;
      local_7e0._8_4_ = uVar123;
      local_7e0._12_4_ = uVar123;
      local_7e0._16_4_ = uVar123;
      local_7e0._20_4_ = uVar123;
      local_7e0._24_4_ = uVar123;
      local_7e0._28_4_ = uVar123;
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar135,local_7e0);
      auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar135,local_4c0);
      auVar181 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x908);
      fVar163 = *(float *)(bspline_basis1 + lVar22 + 0xd8c);
      fVar138 = *(float *)(bspline_basis1 + lVar22 + 0xd90);
      fVar139 = *(float *)(bspline_basis1 + lVar22 + 0xd94);
      fVar140 = *(float *)(bspline_basis1 + lVar22 + 0xd98);
      fVar141 = *(float *)(bspline_basis1 + lVar22 + 0xd9c);
      fVar142 = *(float *)(bspline_basis1 + lVar22 + 0xda0);
      fVar143 = *(float *)(bspline_basis1 + lVar22 + 0xda4);
      auVar25._4_4_ = fVar230 * fVar138;
      auVar25._0_4_ = fVar230 * fVar163;
      auVar25._8_4_ = fVar230 * fVar139;
      auVar25._12_4_ = fVar230 * fVar140;
      auVar25._16_4_ = fVar230 * fVar141;
      auVar25._20_4_ = fVar230 * fVar142;
      auVar25._24_4_ = fVar230 * fVar143;
      auVar25._28_4_ = fVar230;
      auVar7 = vfmadd231ps_fma(auVar25,auVar181,local_6e0);
      auVar26._4_4_ = fVar184 * fVar138;
      auVar26._0_4_ = fVar162 * fVar163;
      auVar26._8_4_ = fVar162 * fVar139;
      auVar26._12_4_ = fVar184 * fVar140;
      auVar26._16_4_ = fVar162 * fVar141;
      auVar26._20_4_ = fVar184 * fVar142;
      auVar26._24_4_ = fVar162 * fVar143;
      auVar26._28_4_ = fVar184;
      auVar207 = vfmadd231ps_fma(auVar26,auVar181,local_800);
      auVar221 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x484);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar221,local_840);
      auVar207 = vfmadd231ps_fma(ZEXT1632(auVar207),auVar221,local_4a0);
      auVar213 = *(undefined1 (*) [32])(bspline_basis1 + lVar22);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar213,local_7e0);
      auVar207 = vfmadd231ps_fma(ZEXT1632(auVar207),auVar213,local_4c0);
      auVar127 = ZEXT1632(auVar7);
      auVar149 = ZEXT1632(auVar6);
      auVar180 = vsubps_avx(auVar127,auVar149);
      auVar177 = ZEXT1632(auVar207);
      auVar188 = ZEXT1632(auVar187);
      auVar21 = vsubps_avx(auVar177,auVar188);
      auVar128._0_4_ = auVar180._0_4_ * auVar187._0_4_;
      auVar128._4_4_ = auVar180._4_4_ * auVar187._4_4_;
      auVar128._8_4_ = auVar180._8_4_ * auVar187._8_4_;
      auVar128._12_4_ = auVar180._12_4_ * auVar187._12_4_;
      auVar128._16_4_ = auVar180._16_4_ * 0.0;
      auVar128._20_4_ = auVar180._20_4_ * 0.0;
      auVar128._24_4_ = auVar180._24_4_ * 0.0;
      auVar128._28_4_ = 0;
      fVar244 = auVar21._0_4_;
      auVar150._0_4_ = fVar244 * auVar6._0_4_;
      fVar247 = auVar21._4_4_;
      auVar150._4_4_ = fVar247 * auVar6._4_4_;
      fVar248 = auVar21._8_4_;
      auVar150._8_4_ = fVar248 * auVar6._8_4_;
      fVar249 = auVar21._12_4_;
      auVar150._12_4_ = fVar249 * auVar6._12_4_;
      fVar250 = auVar21._16_4_;
      auVar150._16_4_ = fVar250 * 0.0;
      fVar251 = auVar21._20_4_;
      auVar150._20_4_ = fVar251 * 0.0;
      fVar252 = auVar21._24_4_;
      auVar150._24_4_ = fVar252 * 0.0;
      auVar150._28_4_ = 0;
      auVar156 = vsubps_avx(auVar128,auVar150);
      auVar187 = vpermilps_avx(auVar8,0xff);
      uVar124 = auVar187._0_8_;
      local_a0._8_8_ = uVar124;
      local_a0._0_8_ = uVar124;
      local_a0._16_8_ = uVar124;
      local_a0._24_8_ = uVar124;
      auVar6 = vpermilps_avx(local_740,0xff);
      uVar124 = auVar6._0_8_;
      local_c0._8_8_ = uVar124;
      local_c0._0_8_ = uVar124;
      local_c0._16_8_ = uVar124;
      local_c0._24_8_ = uVar124;
      auVar6 = vpermilps_avx(local_750,0xff);
      uVar124 = auVar6._0_8_;
      local_e0._8_8_ = uVar124;
      local_e0._0_8_ = uVar124;
      local_e0._16_8_ = uVar124;
      local_e0._24_8_ = uVar124;
      auVar6 = vpermilps_avx(_local_760,0xff);
      local_100 = auVar6._0_8_;
      local_8e0 = auVar114._0_4_;
      fStack_8dc = auVar114._4_4_;
      fStack_8d8 = auVar114._8_4_;
      fStack_8d4 = auVar114._12_4_;
      fStack_8d0 = auVar114._16_4_;
      fStack_8cc = auVar114._20_4_;
      fStack_8c8 = auVar114._24_4_;
      fVar164 = auVar6._0_4_;
      fVar161 = auVar6._4_4_;
      auVar27._4_4_ = fVar161 * fStack_8dc;
      auVar27._0_4_ = fVar164 * local_8e0;
      auVar27._8_4_ = fVar164 * fStack_8d8;
      auVar27._12_4_ = fVar161 * fStack_8d4;
      auVar27._16_4_ = fVar164 * fStack_8d0;
      auVar27._20_4_ = fVar161 * fStack_8cc;
      auVar27._24_4_ = fVar164 * fStack_8c8;
      auVar27._28_4_ = uVar165;
      auVar6 = vfmadd231ps_fma(auVar27,local_e0,auVar20);
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar133,local_c0);
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar135,local_a0);
      uStack_f8 = local_100;
      uStack_f0 = local_100;
      uStack_e8 = local_100;
      auVar28._4_4_ = fVar161 * fVar138;
      auVar28._0_4_ = fVar164 * fVar163;
      auVar28._8_4_ = fVar164 * fVar139;
      auVar28._12_4_ = fVar161 * fVar140;
      auVar28._16_4_ = fVar164 * fVar141;
      auVar28._20_4_ = fVar161 * fVar142;
      auVar28._24_4_ = fVar164 * fVar143;
      auVar28._28_4_ = auVar135._28_4_;
      auVar7 = vfmadd231ps_fma(auVar28,auVar181,local_e0);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar221,local_c0);
      auVar242 = ZEXT3264(auVar213);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar213,local_a0);
      auVar29._4_4_ = fVar247 * fVar247;
      auVar29._0_4_ = fVar244 * fVar244;
      auVar29._8_4_ = fVar248 * fVar248;
      auVar29._12_4_ = fVar249 * fVar249;
      auVar29._16_4_ = fVar250 * fVar250;
      auVar29._20_4_ = fVar251 * fVar251;
      auVar29._24_4_ = fVar252 * fVar252;
      auVar29._28_4_ = auVar187._4_4_;
      auVar187 = vfmadd231ps_fma(auVar29,auVar180,auVar180);
      auVar19 = vmaxps_avx(ZEXT1632(auVar6),ZEXT1632(auVar7));
      auVar30._4_4_ = auVar19._4_4_ * auVar19._4_4_ * auVar187._4_4_;
      auVar30._0_4_ = auVar19._0_4_ * auVar19._0_4_ * auVar187._0_4_;
      auVar30._8_4_ = auVar19._8_4_ * auVar19._8_4_ * auVar187._8_4_;
      auVar30._12_4_ = auVar19._12_4_ * auVar19._12_4_ * auVar187._12_4_;
      auVar30._16_4_ = auVar19._16_4_ * auVar19._16_4_ * 0.0;
      auVar30._20_4_ = auVar19._20_4_ * auVar19._20_4_ * 0.0;
      auVar30._24_4_ = auVar19._24_4_ * auVar19._24_4_ * 0.0;
      auVar30._28_4_ = auVar19._28_4_;
      auVar31._4_4_ = auVar156._4_4_ * auVar156._4_4_;
      auVar31._0_4_ = auVar156._0_4_ * auVar156._0_4_;
      auVar31._8_4_ = auVar156._8_4_ * auVar156._8_4_;
      auVar31._12_4_ = auVar156._12_4_ * auVar156._12_4_;
      auVar31._16_4_ = auVar156._16_4_ * auVar156._16_4_;
      auVar31._20_4_ = auVar156._20_4_ * auVar156._20_4_;
      auVar31._24_4_ = auVar156._24_4_ * auVar156._24_4_;
      auVar31._28_4_ = auVar156._28_4_;
      auVar19 = vcmpps_avx(auVar31,auVar30,2);
      fVar164 = auVar194._0_4_ * 4.7683716e-07;
      auVar129._0_4_ = (float)iVar15;
      local_580._4_12_ = auVar125._4_12_;
      local_580._0_4_ = auVar129._0_4_;
      local_580._16_16_ = auVar147._16_16_;
      auVar129._4_4_ = auVar129._0_4_;
      auVar129._8_4_ = auVar129._0_4_;
      auVar129._12_4_ = auVar129._0_4_;
      auVar129._16_4_ = auVar129._0_4_;
      auVar129._20_4_ = auVar129._0_4_;
      auVar129._24_4_ = auVar129._0_4_;
      auVar129._28_4_ = auVar129._0_4_;
      auVar147 = vcmpps_avx(_DAT_02020f40,auVar129,1);
      auVar187 = vpermilps_avx(auVar9,0xaa);
      uVar124 = auVar187._0_8_;
      local_5a0._8_8_ = uVar124;
      local_5a0._0_8_ = uVar124;
      local_5a0._16_8_ = uVar124;
      local_5a0._24_8_ = uVar124;
      auVar194 = vpermilps_avx(auVar10,0xaa);
      uVar124 = auVar194._0_8_;
      local_680._8_8_ = uVar124;
      local_680._0_8_ = uVar124;
      local_680._16_8_ = uVar124;
      local_680._24_8_ = uVar124;
      auVar194 = vpermilps_avx(auVar11,0xaa);
      uVar124 = auVar194._0_8_;
      local_480._8_8_ = uVar124;
      local_480._0_8_ = uVar124;
      local_480._16_8_ = uVar124;
      local_480._24_8_ = uVar124;
      auVar194 = vshufps_avx(auVar125,auVar125,0xaa);
      uVar124 = auVar194._0_8_;
      auVar156 = auVar147 & auVar19;
      uVar118 = *(uint *)(ray + k * 4 + 0x30);
      local_720._0_16_ = ZEXT416(uVar118);
      local_890 = auVar8._0_8_;
      uStack_888 = auVar8._8_8_;
      fVar161 = fVar230;
      fVar244 = fVar230;
      fVar247 = fVar230;
      fVar248 = fVar230;
      fVar249 = fVar230;
      fVar250 = fVar230;
      fVar251 = fVar162;
      fVar252 = fVar184;
      fVar226 = fVar162;
      fVar227 = fVar184;
      fVar228 = fVar162;
      fVar229 = fVar184;
      uVar236 = uVar124;
      uVar237 = uVar124;
      uVar238 = uVar124;
      uStack_818 = local_820;
      uStack_810 = local_820;
      uStack_808 = local_820;
      local_780 = fVar230;
      fStack_77c = fVar230;
      fStack_778 = fVar230;
      fStack_774 = fVar230;
      fStack_770 = fVar230;
      fStack_76c = fVar230;
      fStack_768 = fVar230;
      fStack_764 = fVar230;
      if ((((((((auVar156 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar156 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar156 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar156 >> 0x7f,0) == '\0') &&
            (auVar156 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar156 >> 0xbf,0) == '\0') &&
          (auVar156 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar156[0x1f]) {
LAB_01963968:
        auVar255 = ZEXT3264(local_840);
        auVar246 = ZEXT3264(local_800);
        auVar215 = ZEXT3264(local_7e0);
      }
      else {
        local_240 = vandps_avx(auVar19,auVar147);
        fVar231 = auVar194._0_4_;
        fVar235 = auVar194._4_4_;
        auVar32._4_4_ = fVar235 * fVar138;
        auVar32._0_4_ = fVar231 * fVar163;
        auVar32._8_4_ = fVar231 * fVar139;
        auVar32._12_4_ = fVar235 * fVar140;
        auVar32._16_4_ = fVar231 * fVar141;
        auVar32._20_4_ = fVar235 * fVar142;
        auVar32._24_4_ = fVar231 * fVar143;
        auVar32._28_4_ = local_240._28_4_;
        auVar194 = vfmadd213ps_fma(auVar181,local_480,auVar32);
        auVar194 = vfmadd213ps_fma(auVar221,local_680,ZEXT1632(auVar194));
        auVar194 = vfmadd213ps_fma(auVar213,local_5a0,ZEXT1632(auVar194));
        local_4e0 = ZEXT1632(auVar194);
        auVar33._4_4_ = fVar235 * fStack_8dc;
        auVar33._0_4_ = fVar231 * local_8e0;
        auVar33._8_4_ = fVar231 * fStack_8d8;
        auVar33._12_4_ = fVar235 * fStack_8d4;
        auVar33._16_4_ = fVar231 * fStack_8d0;
        auVar33._20_4_ = fVar235 * fStack_8cc;
        auVar33._24_4_ = fVar231 * fStack_8c8;
        auVar33._28_4_ = local_240._28_4_;
        auVar194 = vfmadd213ps_fma(auVar20,local_480,auVar33);
        auVar194 = vfmadd213ps_fma(auVar133,local_680,ZEXT1632(auVar194));
        auVar147 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1210);
        auVar20 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1694);
        auVar133 = *(undefined1 (*) [32])(bspline_basis0 + lVar22 + 0x1b18);
        fVar163 = *(float *)(bspline_basis0 + lVar22 + 0x1f9c);
        fVar138 = *(float *)(bspline_basis0 + lVar22 + 0x1fa0);
        fVar139 = *(float *)(bspline_basis0 + lVar22 + 0x1fa4);
        fVar140 = *(float *)(bspline_basis0 + lVar22 + 0x1fa8);
        fVar141 = *(float *)(bspline_basis0 + lVar22 + 0x1fac);
        fVar142 = *(float *)(bspline_basis0 + lVar22 + 0x1fb0);
        fVar143 = *(float *)(bspline_basis0 + lVar22 + 0x1fb4);
        auVar34._4_4_ = fVar138 * fVar230;
        auVar34._0_4_ = fVar163 * fVar230;
        auVar34._8_4_ = fVar139 * fVar230;
        auVar34._12_4_ = fVar140 * fVar230;
        auVar34._16_4_ = fVar141 * fVar230;
        auVar34._20_4_ = fVar142 * fVar230;
        auVar34._24_4_ = fVar143 * fVar230;
        auVar34._28_4_ = auVar187._4_4_;
        auVar35._4_4_ = fVar184 * fVar138;
        auVar35._0_4_ = fVar162 * fVar163;
        auVar35._8_4_ = fVar162 * fVar139;
        auVar35._12_4_ = fVar184 * fVar140;
        auVar35._16_4_ = fVar162 * fVar141;
        auVar35._20_4_ = fVar184 * fVar142;
        auVar35._24_4_ = fVar162 * fVar143;
        auVar35._28_4_ = auVar180._28_4_;
        auVar224._0_4_ = fVar231 * fVar163;
        auVar224._4_4_ = fVar235 * fVar138;
        auVar224._8_4_ = fVar231 * fVar139;
        auVar224._12_4_ = fVar235 * fVar140;
        auVar224._16_4_ = fVar231 * fVar141;
        auVar224._20_4_ = fVar235 * fVar142;
        auVar224._24_4_ = fVar231 * fVar143;
        auVar224._28_4_ = 0;
        auVar187 = vfmadd231ps_fma(auVar34,auVar133,local_6e0);
        auVar207 = vfmadd231ps_fma(auVar35,auVar133,local_800);
        auVar9 = vfmadd231ps_fma(auVar224,local_480,auVar133);
        auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar20,local_840);
        auVar207 = vfmadd231ps_fma(ZEXT1632(auVar207),auVar20,local_4a0);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),local_680,auVar20);
        auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar147,local_7e0);
        auVar207 = vfmadd231ps_fma(ZEXT1632(auVar207),auVar147,local_4c0);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar147,local_5a0);
        fVar163 = *(float *)(bspline_basis1 + lVar22 + 0x1f9c);
        fVar138 = *(float *)(bspline_basis1 + lVar22 + 0x1fa0);
        fVar139 = *(float *)(bspline_basis1 + lVar22 + 0x1fa4);
        fVar140 = *(float *)(bspline_basis1 + lVar22 + 0x1fa8);
        fVar141 = *(float *)(bspline_basis1 + lVar22 + 0x1fac);
        fVar142 = *(float *)(bspline_basis1 + lVar22 + 0x1fb0);
        fVar143 = *(float *)(bspline_basis1 + lVar22 + 0x1fb4);
        auVar20._4_4_ = fVar230 * fVar138;
        auVar20._0_4_ = fVar230 * fVar163;
        auVar20._8_4_ = fVar230 * fVar139;
        auVar20._12_4_ = fVar230 * fVar140;
        auVar20._16_4_ = fVar230 * fVar141;
        auVar20._20_4_ = fVar230 * fVar142;
        auVar20._24_4_ = fVar230 * fVar143;
        auVar20._28_4_ = fVar230;
        auVar36._4_4_ = fVar184 * fVar138;
        auVar36._0_4_ = fVar162 * fVar163;
        auVar36._8_4_ = fVar162 * fVar139;
        auVar36._12_4_ = fVar184 * fVar140;
        auVar36._16_4_ = fVar162 * fVar141;
        auVar36._20_4_ = fVar184 * fVar142;
        auVar36._24_4_ = fVar162 * fVar143;
        auVar36._28_4_ = fVar184;
        uStack_6f8 = uVar124;
        local_700 = uVar124;
        uStack_6f0 = uVar124;
        uStack_6e8 = uVar124;
        auVar37._4_4_ = fVar235 * fVar138;
        auVar37._0_4_ = fVar231 * fVar163;
        auVar37._8_4_ = fVar231 * fVar139;
        auVar37._12_4_ = fVar235 * fVar140;
        auVar37._16_4_ = fVar231 * fVar141;
        auVar37._20_4_ = fVar235 * fVar142;
        auVar37._24_4_ = fVar231 * fVar143;
        auVar37._28_4_ = fVar235;
        auVar147 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1b18);
        auVar10 = vfmadd231ps_fma(auVar20,auVar147,local_6e0);
        auVar11 = vfmadd231ps_fma(auVar36,auVar147,local_800);
        auVar125 = vfmadd231ps_fma(auVar37,auVar147,local_480);
        auVar147 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1694);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar147,local_840);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar147,local_4a0);
        auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),local_680,auVar147);
        auVar147 = *(undefined1 (*) [32])(bspline_basis1 + lVar22 + 0x1210);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar147,local_7e0);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar147,local_4c0);
        auVar125 = vfmadd231ps_fma(ZEXT1632(auVar125),local_5a0,auVar147);
        auVar147 = vandps_avx(local_1e0,ZEXT1632(auVar187));
        auVar20 = vandps_avx(ZEXT1632(auVar207),local_1e0);
        auVar20 = vmaxps_avx(auVar147,auVar20);
        auVar147 = vandps_avx(ZEXT1632(auVar9),local_1e0);
        auVar147 = vmaxps_avx(auVar20,auVar147);
        auVar151._4_4_ = fVar164;
        auVar151._0_4_ = fVar164;
        auVar151._8_4_ = fVar164;
        auVar151._12_4_ = fVar164;
        auVar151._16_4_ = fVar164;
        auVar151._20_4_ = fVar164;
        auVar151._24_4_ = fVar164;
        auVar151._28_4_ = fVar164;
        auVar147 = vcmpps_avx(auVar147,auVar151,1);
        auVar133 = vblendvps_avx(ZEXT1632(auVar187),auVar180,auVar147);
        auVar181 = vblendvps_avx(ZEXT1632(auVar207),auVar21,auVar147);
        auVar147 = vandps_avx(local_1e0,ZEXT1632(auVar10));
        auVar20 = vandps_avx(ZEXT1632(auVar11),local_1e0);
        auVar20 = vmaxps_avx(auVar147,auVar20);
        auVar147 = vandps_avx(ZEXT1632(auVar125),local_1e0);
        auVar147 = vmaxps_avx(auVar20,auVar147);
        auVar20 = vcmpps_avx(auVar147,auVar151,1);
        auVar147 = vblendvps_avx(ZEXT1632(auVar10),auVar180,auVar20);
        auVar20 = vblendvps_avx(ZEXT1632(auVar11),auVar21,auVar20);
        auVar194 = vfmadd213ps_fma(auVar135,local_5a0,ZEXT1632(auVar194));
        auVar187 = vfmadd213ps_fma(auVar133,auVar133,ZEXT832(0) << 0x20);
        auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar181,auVar181);
        auVar135 = vrsqrtps_avx(ZEXT1632(auVar187));
        fVar163 = auVar135._0_4_;
        fVar138 = auVar135._4_4_;
        fVar139 = auVar135._8_4_;
        fVar140 = auVar135._12_4_;
        fVar141 = auVar135._16_4_;
        fVar142 = auVar135._20_4_;
        fVar143 = auVar135._24_4_;
        auVar38._4_4_ = fVar138 * fVar138 * fVar138 * auVar187._4_4_ * -0.5;
        auVar38._0_4_ = fVar163 * fVar163 * fVar163 * auVar187._0_4_ * -0.5;
        auVar38._8_4_ = fVar139 * fVar139 * fVar139 * auVar187._8_4_ * -0.5;
        auVar38._12_4_ = fVar140 * fVar140 * fVar140 * auVar187._12_4_ * -0.5;
        auVar38._16_4_ = fVar141 * fVar141 * fVar141 * -0.0;
        auVar38._20_4_ = fVar142 * fVar142 * fVar142 * -0.0;
        auVar38._24_4_ = fVar143 * fVar143 * fVar143 * -0.0;
        auVar38._28_4_ = 0;
        auVar241._8_4_ = 0x3fc00000;
        auVar241._0_8_ = 0x3fc000003fc00000;
        auVar241._12_4_ = 0x3fc00000;
        auVar241._16_4_ = 0x3fc00000;
        auVar241._20_4_ = 0x3fc00000;
        auVar241._24_4_ = 0x3fc00000;
        auVar241._28_4_ = 0x3fc00000;
        auVar187 = vfmadd231ps_fma(auVar38,auVar241,auVar135);
        fVar163 = auVar187._0_4_;
        fVar138 = auVar187._4_4_;
        auVar39._4_4_ = auVar181._4_4_ * fVar138;
        auVar39._0_4_ = auVar181._0_4_ * fVar163;
        fVar139 = auVar187._8_4_;
        auVar39._8_4_ = auVar181._8_4_ * fVar139;
        fVar140 = auVar187._12_4_;
        auVar39._12_4_ = auVar181._12_4_ * fVar140;
        auVar39._16_4_ = auVar181._16_4_ * 0.0;
        auVar39._20_4_ = auVar181._20_4_ * 0.0;
        auVar39._24_4_ = auVar181._24_4_ * 0.0;
        auVar39._28_4_ = auVar135._28_4_;
        auVar40._4_4_ = -auVar133._4_4_ * fVar138;
        auVar40._0_4_ = -auVar133._0_4_ * fVar163;
        auVar40._8_4_ = -auVar133._8_4_ * fVar139;
        auVar40._12_4_ = -auVar133._12_4_ * fVar140;
        auVar40._16_4_ = -auVar133._16_4_ * 0.0;
        auVar40._20_4_ = -auVar133._20_4_ * 0.0;
        auVar40._24_4_ = -auVar133._24_4_ * 0.0;
        auVar40._28_4_ = auVar180._28_4_;
        auVar187 = vfmadd213ps_fma(auVar147,auVar147,ZEXT832(0) << 0x20);
        auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar20,auVar20);
        auVar133 = vrsqrtps_avx(ZEXT1632(auVar187));
        auVar135 = ZEXT1632(CONCAT412(fVar140 * 0.0,
                                      CONCAT48(fVar139 * 0.0,CONCAT44(fVar138 * 0.0,fVar163 * 0.0)))
                           );
        fVar163 = auVar133._0_4_;
        fVar138 = auVar133._4_4_;
        fVar139 = auVar133._8_4_;
        fVar140 = auVar133._12_4_;
        fVar141 = auVar133._16_4_;
        fVar142 = auVar133._20_4_;
        fVar143 = auVar133._24_4_;
        auVar41._4_4_ = fVar138 * fVar138 * fVar138 * auVar187._4_4_ * -0.5;
        auVar41._0_4_ = fVar163 * fVar163 * fVar163 * auVar187._0_4_ * -0.5;
        auVar41._8_4_ = fVar139 * fVar139 * fVar139 * auVar187._8_4_ * -0.5;
        auVar41._12_4_ = fVar140 * fVar140 * fVar140 * auVar187._12_4_ * -0.5;
        auVar41._16_4_ = fVar141 * fVar141 * fVar141 * -0.0;
        auVar41._20_4_ = fVar142 * fVar142 * fVar142 * -0.0;
        auVar41._24_4_ = fVar143 * fVar143 * fVar143 * -0.0;
        auVar41._28_4_ = 0xbf000000;
        auVar187 = vfmadd231ps_fma(auVar41,auVar241,auVar133);
        fVar163 = auVar187._0_4_;
        fVar138 = auVar187._4_4_;
        auVar42._4_4_ = fVar138 * auVar20._4_4_;
        auVar42._0_4_ = fVar163 * auVar20._0_4_;
        fVar139 = auVar187._8_4_;
        auVar42._8_4_ = fVar139 * auVar20._8_4_;
        fVar140 = auVar187._12_4_;
        auVar42._12_4_ = fVar140 * auVar20._12_4_;
        auVar42._16_4_ = auVar20._16_4_ * 0.0;
        auVar42._20_4_ = auVar20._20_4_ * 0.0;
        auVar42._24_4_ = auVar20._24_4_ * 0.0;
        auVar42._28_4_ = 0;
        auVar43._4_4_ = fVar138 * -auVar147._4_4_;
        auVar43._0_4_ = fVar163 * -auVar147._0_4_;
        auVar43._8_4_ = fVar139 * -auVar147._8_4_;
        auVar43._12_4_ = fVar140 * -auVar147._12_4_;
        auVar43._16_4_ = -auVar147._16_4_ * 0.0;
        auVar43._20_4_ = -auVar147._20_4_ * 0.0;
        auVar43._24_4_ = -auVar147._24_4_ * 0.0;
        auVar43._28_4_ = 0x3fc00000;
        auVar44._28_4_ = auVar133._28_4_;
        auVar44._0_28_ =
             ZEXT1628(CONCAT412(fVar140 * 0.0,
                                CONCAT48(fVar139 * 0.0,CONCAT44(fVar138 * 0.0,fVar163 * 0.0))));
        auVar187 = vfmadd213ps_fma(auVar39,ZEXT1632(auVar6),auVar149);
        auVar147 = ZEXT1632(auVar6);
        auVar207 = vfmadd213ps_fma(auVar40,auVar147,auVar188);
        auVar9 = vfmadd213ps_fma(auVar135,auVar147,ZEXT1632(auVar194));
        auVar166 = vfnmadd213ps_fma(auVar39,auVar147,auVar149);
        auVar10 = vfmadd213ps_fma(auVar42,ZEXT1632(auVar7),auVar127);
        auVar23 = vfnmadd213ps_fma(auVar40,auVar147,auVar188);
        auVar147 = ZEXT1632(auVar7);
        auVar11 = vfmadd213ps_fma(auVar43,auVar147,auVar177);
        auVar210 = ZEXT1632(auVar6);
        auVar194 = vfnmadd231ps_fma(ZEXT1632(auVar194),auVar210,auVar135);
        auVar6 = vfmadd213ps_fma(auVar44,auVar147,local_4e0);
        auVar126 = vfnmadd213ps_fma(auVar42,auVar147,auVar127);
        auVar167 = vfnmadd213ps_fma(auVar43,auVar147,auVar177);
        auVar168 = vfnmadd231ps_fma(local_4e0,ZEXT1632(auVar7),auVar44);
        auVar147 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar23));
        auVar20 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar194));
        auVar178._0_4_ = auVar147._0_4_ * auVar194._0_4_;
        auVar178._4_4_ = auVar147._4_4_ * auVar194._4_4_;
        auVar178._8_4_ = auVar147._8_4_ * auVar194._8_4_;
        auVar178._12_4_ = auVar147._12_4_ * auVar194._12_4_;
        auVar178._16_4_ = auVar147._16_4_ * 0.0;
        auVar178._20_4_ = auVar147._20_4_ * 0.0;
        auVar178._24_4_ = auVar147._24_4_ * 0.0;
        auVar178._28_4_ = 0;
        auVar125 = vfmsub231ps_fma(auVar178,ZEXT1632(auVar23),auVar20);
        auVar45._4_4_ = auVar166._4_4_ * auVar20._4_4_;
        auVar45._0_4_ = auVar166._0_4_ * auVar20._0_4_;
        auVar45._8_4_ = auVar166._8_4_ * auVar20._8_4_;
        auVar45._12_4_ = auVar166._12_4_ * auVar20._12_4_;
        auVar45._16_4_ = auVar20._16_4_ * 0.0;
        auVar45._20_4_ = auVar20._20_4_ * 0.0;
        auVar45._24_4_ = auVar20._24_4_ * 0.0;
        auVar45._28_4_ = auVar20._28_4_;
        auVar213 = ZEXT1632(auVar166);
        auVar20 = vsubps_avx(ZEXT1632(auVar10),auVar213);
        auVar180 = ZEXT1632(auVar194);
        auVar194 = vfmsub231ps_fma(auVar45,auVar180,auVar20);
        auVar46._4_4_ = auVar23._4_4_ * auVar20._4_4_;
        auVar46._0_4_ = auVar23._0_4_ * auVar20._0_4_;
        auVar46._8_4_ = auVar23._8_4_ * auVar20._8_4_;
        auVar46._12_4_ = auVar23._12_4_ * auVar20._12_4_;
        auVar46._16_4_ = auVar20._16_4_ * 0.0;
        auVar46._20_4_ = auVar20._20_4_ * 0.0;
        auVar46._24_4_ = auVar20._24_4_ * 0.0;
        auVar46._28_4_ = auVar20._28_4_;
        auVar166 = vfmsub231ps_fma(auVar46,auVar213,auVar147);
        auVar194 = vfmadd231ps_fma(ZEXT1632(auVar166),ZEXT832(0) << 0x20,ZEXT1632(auVar194));
        local_860 = ZEXT1632(local_240._16_16_);
        auVar194 = vfmadd231ps_fma(ZEXT1632(auVar194),ZEXT832(0) << 0x20,ZEXT1632(auVar125));
        auVar156 = vcmpps_avx(ZEXT1632(auVar194),ZEXT832(0) << 0x20,2);
        auVar147 = vblendvps_avx(ZEXT1632(auVar126),ZEXT1632(auVar187),auVar156);
        auVar20 = vblendvps_avx(ZEXT1632(auVar167),ZEXT1632(auVar207),auVar156);
        auVar133 = vblendvps_avx(ZEXT1632(auVar168),ZEXT1632(auVar9),auVar156);
        auVar135 = vblendvps_avx(auVar213,ZEXT1632(auVar10),auVar156);
        auVar181 = vblendvps_avx(ZEXT1632(auVar23),ZEXT1632(auVar11),auVar156);
        auVar221 = vblendvps_avx(auVar180,ZEXT1632(auVar6),auVar156);
        auVar213 = vblendvps_avx(ZEXT1632(auVar10),auVar213,auVar156);
        auVar19 = vblendvps_avx(ZEXT1632(auVar11),ZEXT1632(auVar23),auVar156);
        auVar194 = vpackssdw_avx(local_240._0_16_,local_240._16_16_);
        auVar180 = vblendvps_avx(ZEXT1632(auVar6),auVar180,auVar156);
        auVar127 = vsubps_avx(auVar213,auVar147);
        auVar19 = vsubps_avx(auVar19,auVar20);
        auVar149 = vsubps_avx(auVar180,auVar133);
        auVar177 = vsubps_avx(auVar147,auVar135);
        auVar188 = vsubps_avx(auVar20,auVar181);
        auVar205 = vsubps_avx(auVar133,auVar221);
        auVar47._4_4_ = auVar149._4_4_ * auVar147._4_4_;
        auVar47._0_4_ = auVar149._0_4_ * auVar147._0_4_;
        auVar47._8_4_ = auVar149._8_4_ * auVar147._8_4_;
        auVar47._12_4_ = auVar149._12_4_ * auVar147._12_4_;
        auVar47._16_4_ = auVar149._16_4_ * auVar147._16_4_;
        auVar47._20_4_ = auVar149._20_4_ * auVar147._20_4_;
        auVar47._24_4_ = auVar149._24_4_ * auVar147._24_4_;
        auVar47._28_4_ = auVar180._28_4_;
        auVar187 = vfmsub231ps_fma(auVar47,auVar133,auVar127);
        auVar48._4_4_ = auVar127._4_4_ * auVar20._4_4_;
        auVar48._0_4_ = auVar127._0_4_ * auVar20._0_4_;
        auVar48._8_4_ = auVar127._8_4_ * auVar20._8_4_;
        auVar48._12_4_ = auVar127._12_4_ * auVar20._12_4_;
        auVar48._16_4_ = auVar127._16_4_ * auVar20._16_4_;
        auVar48._20_4_ = auVar127._20_4_ * auVar20._20_4_;
        auVar48._24_4_ = auVar127._24_4_ * auVar20._24_4_;
        auVar48._28_4_ = auVar213._28_4_;
        auVar6 = vfmsub231ps_fma(auVar48,auVar147,auVar19);
        auVar187 = vfmadd231ps_fma(ZEXT1632(auVar6),ZEXT832(0) << 0x20,ZEXT1632(auVar187));
        auVar130._0_4_ = auVar19._0_4_ * auVar133._0_4_;
        auVar130._4_4_ = auVar19._4_4_ * auVar133._4_4_;
        auVar130._8_4_ = auVar19._8_4_ * auVar133._8_4_;
        auVar130._12_4_ = auVar19._12_4_ * auVar133._12_4_;
        auVar130._16_4_ = auVar19._16_4_ * auVar133._16_4_;
        auVar130._20_4_ = auVar19._20_4_ * auVar133._20_4_;
        auVar130._24_4_ = auVar19._24_4_ * auVar133._24_4_;
        auVar130._28_4_ = 0;
        auVar6 = vfmsub231ps_fma(auVar130,auVar20,auVar149);
        auVar6 = vfmadd231ps_fma(ZEXT1632(auVar187),ZEXT832(0) << 0x20,ZEXT1632(auVar6));
        auVar131._0_4_ = auVar205._0_4_ * auVar135._0_4_;
        auVar131._4_4_ = auVar205._4_4_ * auVar135._4_4_;
        auVar131._8_4_ = auVar205._8_4_ * auVar135._8_4_;
        auVar131._12_4_ = auVar205._12_4_ * auVar135._12_4_;
        auVar131._16_4_ = auVar205._16_4_ * auVar135._16_4_;
        auVar131._20_4_ = auVar205._20_4_ * auVar135._20_4_;
        auVar131._24_4_ = auVar205._24_4_ * auVar135._24_4_;
        auVar131._28_4_ = 0;
        auVar187 = vfmsub231ps_fma(auVar131,auVar177,auVar221);
        auVar49._4_4_ = auVar188._4_4_ * auVar221._4_4_;
        auVar49._0_4_ = auVar188._0_4_ * auVar221._0_4_;
        auVar49._8_4_ = auVar188._8_4_ * auVar221._8_4_;
        auVar49._12_4_ = auVar188._12_4_ * auVar221._12_4_;
        auVar49._16_4_ = auVar188._16_4_ * auVar221._16_4_;
        auVar49._20_4_ = auVar188._20_4_ * auVar221._20_4_;
        auVar49._24_4_ = auVar188._24_4_ * auVar221._24_4_;
        auVar49._28_4_ = auVar221._28_4_;
        auVar207 = vfmsub231ps_fma(auVar49,auVar181,auVar205);
        auVar50._4_4_ = auVar177._4_4_ * auVar181._4_4_;
        auVar50._0_4_ = auVar177._0_4_ * auVar181._0_4_;
        auVar50._8_4_ = auVar177._8_4_ * auVar181._8_4_;
        auVar50._12_4_ = auVar177._12_4_ * auVar181._12_4_;
        auVar50._16_4_ = auVar177._16_4_ * auVar181._16_4_;
        auVar50._20_4_ = auVar177._20_4_ * auVar181._20_4_;
        auVar50._24_4_ = auVar177._24_4_ * auVar181._24_4_;
        auVar50._28_4_ = auVar181._28_4_;
        auVar9 = vfmsub231ps_fma(auVar50,auVar188,auVar135);
        auVar187 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT832(0) << 0x20,ZEXT1632(auVar187));
        auVar207 = vfmadd231ps_fma(ZEXT1632(auVar187),ZEXT832(0) << 0x20,ZEXT1632(auVar207));
        auVar135 = vmaxps_avx(ZEXT1632(auVar6),ZEXT1632(auVar207));
        auVar135 = vcmpps_avx(auVar135,ZEXT832(0) << 0x20,2);
        auVar187 = vpackssdw_avx(auVar135._0_16_,auVar135._16_16_);
        auVar194 = vpand_avx(auVar194,auVar187);
        auVar135 = vpmovsxwd_avx2(auVar194);
        if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar135 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar135 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar135 >> 0x7f,0) == '\0') &&
              (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar135 >> 0xbf,0) == '\0') &&
            (auVar135 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar135[0x1f]) {
LAB_01965321:
          auVar215 = ZEXT3264(CONCAT824(uStack_5a8,
                                        CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
          auVar222 = ZEXT3264(local_620);
          auVar183 = ZEXT3264(local_640);
        }
        else {
          auVar51._4_4_ = auVar19._4_4_ * auVar205._4_4_;
          auVar51._0_4_ = auVar19._0_4_ * auVar205._0_4_;
          auVar51._8_4_ = auVar19._8_4_ * auVar205._8_4_;
          auVar51._12_4_ = auVar19._12_4_ * auVar205._12_4_;
          auVar51._16_4_ = auVar19._16_4_ * auVar205._16_4_;
          auVar51._20_4_ = auVar19._20_4_ * auVar205._20_4_;
          auVar51._24_4_ = auVar19._24_4_ * auVar205._24_4_;
          auVar51._28_4_ = auVar135._28_4_;
          auVar11 = vfmsub231ps_fma(auVar51,auVar188,auVar149);
          auVar152._0_4_ = auVar177._0_4_ * auVar149._0_4_;
          auVar152._4_4_ = auVar177._4_4_ * auVar149._4_4_;
          auVar152._8_4_ = auVar177._8_4_ * auVar149._8_4_;
          auVar152._12_4_ = auVar177._12_4_ * auVar149._12_4_;
          auVar152._16_4_ = auVar177._16_4_ * auVar149._16_4_;
          auVar152._20_4_ = auVar177._20_4_ * auVar149._20_4_;
          auVar152._24_4_ = auVar177._24_4_ * auVar149._24_4_;
          auVar152._28_4_ = 0;
          auVar10 = vfmsub231ps_fma(auVar152,auVar127,auVar205);
          auVar52._4_4_ = auVar127._4_4_ * auVar188._4_4_;
          auVar52._0_4_ = auVar127._0_4_ * auVar188._0_4_;
          auVar52._8_4_ = auVar127._8_4_ * auVar188._8_4_;
          auVar52._12_4_ = auVar127._12_4_ * auVar188._12_4_;
          auVar52._16_4_ = auVar127._16_4_ * auVar188._16_4_;
          auVar52._20_4_ = auVar127._20_4_ * auVar188._20_4_;
          auVar52._24_4_ = auVar127._24_4_ * auVar188._24_4_;
          auVar52._28_4_ = auVar127._28_4_;
          auVar125 = vfmsub231ps_fma(auVar52,auVar177,auVar19);
          auVar187 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar10),ZEXT1632(auVar125));
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar187),ZEXT1632(auVar11),_DAT_02020f00);
          auVar135 = vrcpps_avx(ZEXT1632(auVar9));
          auVar225._8_4_ = 0x3f800000;
          auVar225._0_8_ = &DAT_3f8000003f800000;
          auVar225._12_4_ = 0x3f800000;
          auVar225._16_4_ = 0x3f800000;
          auVar225._20_4_ = 0x3f800000;
          auVar225._24_4_ = 0x3f800000;
          auVar225._28_4_ = 0x3f800000;
          auVar187 = vfnmadd213ps_fma(auVar135,ZEXT1632(auVar9),auVar225);
          auVar187 = vfmadd132ps_fma(ZEXT1632(auVar187),auVar135,auVar135);
          auVar53._4_4_ = auVar125._4_4_ * auVar133._4_4_;
          auVar53._0_4_ = auVar125._0_4_ * auVar133._0_4_;
          auVar53._8_4_ = auVar125._8_4_ * auVar133._8_4_;
          auVar53._12_4_ = auVar125._12_4_ * auVar133._12_4_;
          auVar53._16_4_ = auVar133._16_4_ * 0.0;
          auVar53._20_4_ = auVar133._20_4_ * 0.0;
          auVar53._24_4_ = auVar133._24_4_ * 0.0;
          auVar53._28_4_ = auVar133._28_4_;
          auVar10 = vfmadd231ps_fma(auVar53,auVar20,ZEXT1632(auVar10));
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar11),auVar147);
          fVar163 = auVar187._0_4_;
          fVar138 = auVar187._4_4_;
          fVar139 = auVar187._8_4_;
          fVar140 = auVar187._12_4_;
          auVar54._28_4_ = auVar20._28_4_;
          auVar54._0_28_ =
               ZEXT1628(CONCAT412(fVar140 * auVar10._12_4_,
                                  CONCAT48(fVar139 * auVar10._8_4_,
                                           CONCAT44(fVar138 * auVar10._4_4_,fVar163 * auVar10._0_4_)
                                          )));
          auVar132._4_4_ = uVar118;
          auVar132._0_4_ = uVar118;
          auVar132._8_4_ = uVar118;
          auVar132._12_4_ = uVar118;
          auVar132._16_4_ = uVar118;
          auVar132._20_4_ = uVar118;
          auVar132._24_4_ = uVar118;
          auVar132._28_4_ = uVar118;
          uVar123 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar153._4_4_ = uVar123;
          auVar153._0_4_ = uVar123;
          auVar153._8_4_ = uVar123;
          auVar153._12_4_ = uVar123;
          auVar153._16_4_ = uVar123;
          auVar153._20_4_ = uVar123;
          auVar153._24_4_ = uVar123;
          auVar153._28_4_ = uVar123;
          auVar147 = vcmpps_avx(auVar132,auVar54,2);
          auVar20 = vcmpps_avx(auVar54,auVar153,2);
          auVar147 = vandps_avx(auVar20,auVar147);
          auVar187 = vpackssdw_avx(auVar147._0_16_,auVar147._16_16_);
          auVar194 = vpand_avx(auVar194,auVar187);
          auVar147 = vpmovsxwd_avx2(auVar194);
          if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar147 >> 0x7f,0) == '\0') &&
                (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar147 >> 0xbf,0) == '\0') &&
              (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar147[0x1f]) goto LAB_01965321;
          auVar147 = vcmpps_avx(ZEXT1632(auVar9),ZEXT832(0) << 0x20,4);
          auVar187 = vpackssdw_avx(auVar147._0_16_,auVar147._16_16_);
          auVar194 = vpand_avx(auVar194,auVar187);
          auVar147 = vpmovsxwd_avx2(auVar194);
          auVar215 = ZEXT3264(CONCAT824(uStack_5a8,
                                        CONCAT816(uStack_5b0,CONCAT88(uStack_5b8,local_5c0))));
          auVar222 = ZEXT3264(local_620);
          auVar183 = ZEXT3264(local_640);
          if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar147 >> 0x7f,0) != '\0') ||
                (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar147 >> 0xbf,0) != '\0') ||
              (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar147[0x1f] < '\0') {
            auVar133 = ZEXT1632(CONCAT412(fVar140 * auVar6._12_4_,
                                          CONCAT48(fVar139 * auVar6._8_4_,
                                                   CONCAT44(fVar138 * auVar6._4_4_,
                                                            fVar163 * auVar6._0_4_))));
            auVar135 = ZEXT1632(CONCAT412(fVar140 * auVar207._12_4_,
                                          CONCAT48(fVar139 * auVar207._8_4_,
                                                   CONCAT44(fVar138 * auVar207._4_4_,
                                                            fVar163 * auVar207._0_4_))));
            auVar201._8_4_ = 0x3f800000;
            auVar201._0_8_ = &DAT_3f8000003f800000;
            auVar201._12_4_ = 0x3f800000;
            auVar201._16_4_ = 0x3f800000;
            auVar201._20_4_ = 0x3f800000;
            auVar201._24_4_ = 0x3f800000;
            auVar201._28_4_ = 0x3f800000;
            auVar20 = vsubps_avx(auVar201,auVar133);
            auVar20 = vblendvps_avx(auVar20,auVar133,auVar156);
            auVar222 = ZEXT3264(auVar20);
            auVar20 = vsubps_avx(auVar201,auVar135);
            local_260 = vblendvps_avx(auVar20,auVar135,auVar156);
            auVar215 = ZEXT3264(auVar147);
            auVar183 = ZEXT3264(auVar54);
          }
        }
        local_620 = auVar222._0_32_;
        auVar242 = ZEXT3264(local_680);
        auVar255 = ZEXT3264(local_840);
        auVar246 = ZEXT3264(local_800);
        local_640 = auVar183._0_32_;
        auVar133 = auVar215._0_32_;
        auVar147 = local_640;
        auVar20 = local_620;
        if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar133 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar133 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar133 >> 0x7f,0) == '\0') &&
              (auVar215 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar133 >> 0xbf,0) == '\0') &&
            (auVar215 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar215[0x1f]) {
          auVar215 = ZEXT3264(local_7e0);
        }
        else {
          auVar135 = vsubps_avx(ZEXT1632(auVar7),auVar210);
          auVar194 = vfmadd213ps_fma(auVar135,local_620,auVar210);
          fVar163 = *(float *)((long)local_868->ray_space + k * 4 + -0x10);
          auVar55._4_4_ = (auVar194._4_4_ + auVar194._4_4_) * fVar163;
          auVar55._0_4_ = (auVar194._0_4_ + auVar194._0_4_) * fVar163;
          auVar55._8_4_ = (auVar194._8_4_ + auVar194._8_4_) * fVar163;
          auVar55._12_4_ = (auVar194._12_4_ + auVar194._12_4_) * fVar163;
          auVar55._16_4_ = fVar163 * 0.0;
          auVar55._20_4_ = fVar163 * 0.0;
          auVar55._24_4_ = fVar163 * 0.0;
          auVar55._28_4_ = 0;
          auVar135 = vcmpps_avx(local_640,auVar55,6);
          auVar181 = auVar133 & auVar135;
          auVar215 = ZEXT3264(local_7e0);
          if ((((((((auVar181 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar181 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar181 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar181 >> 0x7f,0) == '\0') &&
                (auVar181 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar181 >> 0xbf,0) == '\0') &&
              (auVar181 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar181[0x1f]) goto LAB_01963968;
          local_300 = vandps_avx(auVar135,auVar133);
          auVar154._8_4_ = 0xbf800000;
          auVar154._0_8_ = 0xbf800000bf800000;
          auVar154._12_4_ = 0xbf800000;
          auVar154._16_4_ = 0xbf800000;
          auVar154._20_4_ = 0xbf800000;
          auVar154._24_4_ = 0xbf800000;
          auVar154._28_4_ = 0xbf800000;
          auVar179._8_4_ = 0x40000000;
          auVar179._0_8_ = 0x4000000040000000;
          auVar179._12_4_ = 0x40000000;
          auVar179._16_4_ = 0x40000000;
          auVar179._20_4_ = 0x40000000;
          auVar179._24_4_ = 0x40000000;
          auVar179._28_4_ = 0x40000000;
          auVar194 = vfmadd213ps_fma(local_260,auVar179,auVar154);
          local_3c0 = local_620;
          local_260 = ZEXT1632(auVar194);
          auVar133 = local_260;
          local_3a0 = ZEXT1632(auVar194);
          local_380 = local_640;
          local_360 = 0;
          local_35c = iVar15;
          local_350 = local_890;
          uStack_348 = uStack_888;
          local_340 = local_740._0_8_;
          uStack_338 = local_740._8_8_;
          local_330 = local_750._0_8_;
          uStack_328 = local_750._8_8_;
          local_320 = local_760;
          uStack_318 = uStack_758;
          local_260 = auVar133;
          if ((pGVar122->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            fVar163 = 1.0 / auVar129._0_4_;
            local_2e0[0] = fVar163 * (auVar222._0_4_ + 0.0);
            local_2e0[1] = fVar163 * (auVar222._4_4_ + 1.0);
            local_2e0[2] = fVar163 * (auVar222._8_4_ + 2.0);
            local_2e0[3] = fVar163 * (auVar222._12_4_ + 3.0);
            fStack_2d0 = fVar163 * (auVar222._16_4_ + 4.0);
            fStack_2cc = fVar163 * (auVar222._20_4_ + 5.0);
            fStack_2c8 = fVar163 * (auVar222._24_4_ + 6.0);
            fStack_2c4 = auVar222._28_4_ + 7.0;
            local_260._0_8_ = auVar194._0_8_;
            local_260._8_8_ = auVar194._8_8_;
            local_2c0 = local_260._0_8_;
            uStack_2b8 = local_260._8_8_;
            uStack_2b0 = 0;
            uStack_2a8 = 0;
            local_2a0 = local_640;
            auVar155._8_4_ = 0x7f800000;
            auVar155._0_8_ = 0x7f8000007f800000;
            auVar155._12_4_ = 0x7f800000;
            auVar155._16_4_ = 0x7f800000;
            auVar155._20_4_ = 0x7f800000;
            auVar155._24_4_ = 0x7f800000;
            auVar155._28_4_ = 0x7f800000;
            auVar133 = vblendvps_avx(auVar155,local_640,local_300);
            auVar135 = vshufps_avx(auVar133,auVar133,0xb1);
            auVar135 = vminps_avx(auVar133,auVar135);
            auVar181 = vshufpd_avx(auVar135,auVar135,5);
            auVar135 = vminps_avx(auVar135,auVar181);
            auVar181 = vpermpd_avx2(auVar135,0x4e);
            auVar135 = vminps_avx(auVar135,auVar181);
            auVar135 = vcmpps_avx(auVar133,auVar135,0);
            auVar181 = local_300 & auVar135;
            auVar133 = local_300;
            if ((((((((auVar181 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar181 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar181 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar181 >> 0x7f,0) != '\0') ||
                  (auVar181 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar181 >> 0xbf,0) != '\0') ||
                (auVar181 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar181[0x1f] < '\0') {
              auVar133 = vandps_avx(auVar135,local_300);
            }
            uVar116 = vmovmskps_avx(auVar133);
            uVar118 = 0;
            for (; (uVar116 & 1) == 0; uVar116 = uVar116 >> 1 | 0x80000000) {
              uVar118 = uVar118 + 1;
            }
            uVar117 = (ulong)uVar118;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar122->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar163 = local_2e0[uVar117];
              uVar123 = *(undefined4 *)((long)&local_2c0 + uVar117 * 4);
              fVar138 = 1.0 - fVar163;
              auVar194 = ZEXT416((uint)(fVar163 * fVar138 * 4.0));
              auVar187 = vfnmsub213ss_fma(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),auVar194);
              auVar194 = vfmadd213ss_fma(ZEXT416((uint)fVar138),ZEXT416((uint)fVar138),auVar194);
              fVar138 = fVar138 * -fVar138 * 0.5;
              fVar139 = auVar187._0_4_ * 0.5;
              fVar140 = auVar194._0_4_ * 0.5;
              fVar141 = fVar163 * fVar163 * 0.5;
              auVar192._0_4_ = fVar141 * (float)local_760._0_4_;
              auVar192._4_4_ = fVar141 * (float)local_760._4_4_;
              auVar192._8_4_ = fVar141 * (float)uStack_758;
              auVar192._12_4_ = fVar141 * uStack_758._4_4_;
              auVar169._4_4_ = fVar140;
              auVar169._0_4_ = fVar140;
              auVar169._8_4_ = fVar140;
              auVar169._12_4_ = fVar140;
              auVar194 = vfmadd132ps_fma(auVar169,auVar192,local_750);
              auVar193._4_4_ = fVar139;
              auVar193._0_4_ = fVar139;
              auVar193._8_4_ = fVar139;
              auVar193._12_4_ = fVar139;
              auVar194 = vfmadd132ps_fma(auVar193,auVar194,local_740);
              auVar170._4_4_ = fVar138;
              auVar170._0_4_ = fVar138;
              auVar170._8_4_ = fVar138;
              auVar170._12_4_ = fVar138;
              auVar194 = vfmadd132ps_fma(auVar170,auVar194,auVar8);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2a0 + uVar117 * 4);
              *(int *)(ray + k * 4 + 0xc0) = auVar194._0_4_;
              uVar165 = vextractps_avx(auVar194,1);
              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar165;
              uVar165 = vextractps_avx(auVar194,2);
              *(undefined4 *)(ray + k * 4 + 0xe0) = uVar165;
              *(float *)(ray + k * 4 + 0xf0) = fVar163;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar123;
              *(uint *)(ray + k * 4 + 0x110) = uVar14;
              *(uint *)(ray + k * 4 + 0x120) = uVar13;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
            else {
              _local_6a0 = CONCAT412(uVar13,CONCAT48(uVar13,CONCAT44(uVar13,uVar13)));
              _local_6a0 = ZEXT1632(_local_6a0);
              local_6c0._0_8_ = CONCAT44(uVar14,uVar14);
              local_6c0 = ZEXT1632(CONCAT412(uVar14,CONCAT48(uVar14,local_6c0._0_8_)));
              local_660 = ZEXT1632(local_740);
              local_520 = ZEXT1632(local_750);
              _local_540 = ZEXT1632(_local_760);
              local_560._16_16_ = auVar21._16_16_;
              local_560._0_16_ = *local_728;
              local_600 = local_300;
              do {
                local_860._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                fVar163 = local_2e0[uVar117];
                local_420._4_4_ = fVar163;
                local_420._0_4_ = fVar163;
                local_420._8_4_ = fVar163;
                local_420._12_4_ = fVar163;
                uVar123 = *(undefined4 *)((long)&local_2c0 + uVar117 * 4);
                auVar145._4_4_ = uVar123;
                auVar145._0_4_ = uVar123;
                auVar145._8_4_ = uVar123;
                auVar145._12_4_ = uVar123;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2a0 + uVar117 * 4);
                fVar139 = 1.0 - fVar163;
                auVar194 = ZEXT416((uint)(fVar163 * fVar139 * 4.0));
                auVar187 = vfnmsub213ss_fma(local_420,local_420,auVar194);
                auVar194 = vfmadd213ss_fma(ZEXT416((uint)fVar139),ZEXT416((uint)fVar139),auVar194);
                fVar138 = auVar194._0_4_ * 0.5;
                fVar163 = fVar163 * fVar163 * 0.5;
                auVar199._0_4_ = fVar163 * (float)local_540._0_4_;
                auVar199._4_4_ = fVar163 * (float)local_540._4_4_;
                auVar199._8_4_ = fVar163 * fStack_538;
                auVar199._12_4_ = fVar163 * fStack_534;
                auVar175._4_4_ = fVar138;
                auVar175._0_4_ = fVar138;
                auVar175._8_4_ = fVar138;
                auVar175._12_4_ = fVar138;
                auVar194 = vfmadd132ps_fma(auVar175,auVar199,local_520._0_16_);
                fVar163 = auVar187._0_4_ * 0.5;
                auVar200._4_4_ = fVar163;
                auVar200._0_4_ = fVar163;
                auVar200._8_4_ = fVar163;
                auVar200._12_4_ = fVar163;
                auVar194 = vfmadd132ps_fma(auVar200,auVar194,local_660._0_16_);
                local_7b0.context = context->user;
                fVar163 = fVar139 * -fVar139 * 0.5;
                auVar176._4_4_ = fVar163;
                auVar176._0_4_ = fVar163;
                auVar176._8_4_ = fVar163;
                auVar176._12_4_ = fVar163;
                auVar187 = vfmadd132ps_fma(auVar176,auVar194,auVar8);
                uVar123 = auVar187._0_4_;
                local_450[0] = (RTCHitN)(char)uVar123;
                local_450[1] = (RTCHitN)(char)((uint)uVar123 >> 8);
                local_450[2] = (RTCHitN)(char)((uint)uVar123 >> 0x10);
                local_450[3] = (RTCHitN)(char)((uint)uVar123 >> 0x18);
                local_450[4] = (RTCHitN)(char)uVar123;
                local_450[5] = (RTCHitN)(char)((uint)uVar123 >> 8);
                local_450[6] = (RTCHitN)(char)((uint)uVar123 >> 0x10);
                local_450[7] = (RTCHitN)(char)((uint)uVar123 >> 0x18);
                local_450[8] = (RTCHitN)(char)uVar123;
                local_450[9] = (RTCHitN)(char)((uint)uVar123 >> 8);
                local_450[10] = (RTCHitN)(char)((uint)uVar123 >> 0x10);
                local_450[0xb] = (RTCHitN)(char)((uint)uVar123 >> 0x18);
                local_450[0xc] = (RTCHitN)(char)uVar123;
                local_450[0xd] = (RTCHitN)(char)((uint)uVar123 >> 8);
                local_450[0xe] = (RTCHitN)(char)((uint)uVar123 >> 0x10);
                local_450[0xf] = (RTCHitN)(char)((uint)uVar123 >> 0x18);
                auVar194 = vshufps_avx(auVar187,auVar187,0x55);
                local_440 = auVar194;
                local_430 = vshufps_avx(auVar187,auVar187,0xaa);
                local_410 = auVar145;
                local_400 = local_6c0._0_8_;
                uStack_3f8 = local_6c0._8_8_;
                local_3f0 = _local_6a0;
                vpcmpeqd_avx2(ZEXT1632(_local_6a0),ZEXT1632(_local_6a0));
                uStack_3dc = (local_7b0.context)->instID[0];
                local_3e0 = uStack_3dc;
                uStack_3d8 = uStack_3dc;
                uStack_3d4 = uStack_3dc;
                uStack_3d0 = (local_7b0.context)->instPrimID[0];
                uStack_3cc = uStack_3d0;
                uStack_3c8 = uStack_3d0;
                uStack_3c4 = uStack_3d0;
                local_880 = local_560._0_8_;
                uStack_878 = local_560._8_8_;
                local_7b0.valid = (int *)&local_880;
                local_7b0.geometryUserPtr = pGVar122->userPtr;
                local_7b0.hit = local_450;
                local_7b0.N = 4;
                local_7b0.ray = (RTCRayN *)ray;
                if (pGVar122->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar122->intersectionFilterN)(&local_7b0);
                  auVar215._8_56_ = extraout_var;
                  auVar215._0_8_ = extraout_XMM1_Qa;
                  auVar145 = auVar215._0_16_;
                  auVar242 = ZEXT3264(local_680);
                  auVar215 = ZEXT3264(local_7e0);
                  auVar255 = ZEXT3264(local_840);
                  auVar246 = ZEXT3264(local_800);
                  auVar183 = ZEXT3264(local_640);
                  auVar222 = ZEXT3264(local_620);
                  fVar230 = local_780;
                  fVar161 = fStack_77c;
                  fVar244 = fStack_778;
                  fVar247 = fStack_774;
                  fVar248 = fStack_770;
                  fVar249 = fStack_76c;
                  fVar250 = fStack_768;
                  fVar162 = (float)local_820;
                  fVar184 = local_820._4_4_;
                  fVar251 = (float)uStack_818;
                  fVar252 = uStack_818._4_4_;
                  fVar226 = (float)uStack_810;
                  fVar227 = uStack_810._4_4_;
                  fVar228 = (float)uStack_808;
                  fVar229 = uStack_808._4_4_;
                  uVar124 = local_700;
                  uVar236 = uStack_6f8;
                  uVar237 = uStack_6f0;
                  uVar238 = uStack_6e8;
                }
                auVar110._8_8_ = uStack_878;
                auVar110._0_8_ = local_880;
                if (auVar110 == (undefined1  [16])0x0) {
                  auVar194 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                  auVar187 = vpcmpeqd_avx(auVar145,auVar145);
                  auVar194 = auVar194 ^ auVar187;
                }
                else {
                  p_Var18 = context->args->filter;
                  auVar187 = vpcmpeqd_avx(auVar194,auVar194);
                  auVar147 = auVar242._0_32_;
                  if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((pGVar122->field_8).field_0x2 & 0x40) != 0)))) {
                    (*p_Var18)(&local_7b0);
                    auVar215 = ZEXT3264(local_7e0);
                    auVar255 = ZEXT3264(local_840);
                    auVar246 = ZEXT3264(local_800);
                    auVar183 = ZEXT3264(local_640);
                    auVar222 = ZEXT3264(local_620);
                    auVar187 = vpcmpeqd_avx(auVar187,auVar187);
                    auVar147 = local_680;
                    fVar230 = local_780;
                    fVar161 = fStack_77c;
                    fVar244 = fStack_778;
                    fVar247 = fStack_774;
                    fVar248 = fStack_770;
                    fVar249 = fStack_76c;
                    fVar250 = fStack_768;
                    fVar162 = (float)local_820;
                    fVar184 = local_820._4_4_;
                    fVar251 = (float)uStack_818;
                    fVar252 = uStack_818._4_4_;
                    fVar226 = (float)uStack_810;
                    fVar227 = uStack_810._4_4_;
                    fVar228 = (float)uStack_808;
                    fVar229 = uStack_808._4_4_;
                    uVar124 = local_700;
                    uVar236 = uStack_6f8;
                    uVar237 = uStack_6f0;
                    uVar238 = uStack_6e8;
                  }
                  auVar111._8_8_ = uStack_878;
                  auVar111._0_8_ = local_880;
                  auVar6 = vpcmpeqd_avx(auVar111,_DAT_01feba10);
                  auVar194 = auVar6 ^ auVar187;
                  if (auVar111 != (undefined1  [16])0x0) {
                    auVar6 = auVar6 ^ auVar187;
                    auVar187 = vmaskmovps_avx(auVar6,*(undefined1 (*) [16])local_7b0.hit);
                    *(undefined1 (*) [16])(local_7b0.ray + 0xc0) = auVar187;
                    auVar187 = vmaskmovps_avx(auVar6,*(undefined1 (*) [16])(local_7b0.hit + 0x10));
                    *(undefined1 (*) [16])(local_7b0.ray + 0xd0) = auVar187;
                    auVar187 = vmaskmovps_avx(auVar6,*(undefined1 (*) [16])(local_7b0.hit + 0x20));
                    *(undefined1 (*) [16])(local_7b0.ray + 0xe0) = auVar187;
                    auVar187 = vmaskmovps_avx(auVar6,*(undefined1 (*) [16])(local_7b0.hit + 0x30));
                    *(undefined1 (*) [16])(local_7b0.ray + 0xf0) = auVar187;
                    auVar187 = vmaskmovps_avx(auVar6,*(undefined1 (*) [16])(local_7b0.hit + 0x40));
                    *(undefined1 (*) [16])(local_7b0.ray + 0x100) = auVar187;
                    auVar187 = vmaskmovps_avx(auVar6,*(undefined1 (*) [16])(local_7b0.hit + 0x50));
                    *(undefined1 (*) [16])(local_7b0.ray + 0x110) = auVar187;
                    auVar187 = vmaskmovps_avx(auVar6,*(undefined1 (*) [16])(local_7b0.hit + 0x60));
                    *(undefined1 (*) [16])(local_7b0.ray + 0x120) = auVar187;
                    auVar187 = vmaskmovps_avx(auVar6,*(undefined1 (*) [16])(local_7b0.hit + 0x70));
                    *(undefined1 (*) [16])(local_7b0.ray + 0x130) = auVar187;
                    auVar187 = vmaskmovps_avx(auVar6,*(undefined1 (*) [16])(local_7b0.hit + 0x80));
                    *(undefined1 (*) [16])(local_7b0.ray + 0x140) = auVar187;
                  }
                  auVar242 = ZEXT3264(auVar147);
                }
                auVar147 = auVar183._0_32_;
                auVar146._8_8_ = 0x100000001;
                auVar146._0_8_ = 0x100000001;
                if ((auVar146 & auVar194) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_860._0_4_;
                }
                *(undefined4 *)(local_600 + uVar117 * 4) = 0;
                uVar123 = *(undefined4 *)(ray + k * 4 + 0x80);
                auVar137._4_4_ = uVar123;
                auVar137._0_4_ = uVar123;
                auVar137._8_4_ = uVar123;
                auVar137._12_4_ = uVar123;
                auVar137._16_4_ = uVar123;
                auVar137._20_4_ = uVar123;
                auVar137._24_4_ = uVar123;
                auVar137._28_4_ = uVar123;
                auVar133 = vcmpps_avx(auVar147,auVar137,2);
                auVar20 = vandps_avx(auVar133,local_600);
                local_600 = local_600 & auVar133;
                bVar95 = (local_600 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                bVar96 = (local_600 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                bVar94 = (local_600 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                bVar93 = SUB321(local_600 >> 0x7f,0) != '\0';
                bVar92 = (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                bVar91 = SUB321(local_600 >> 0xbf,0) != '\0';
                bVar89 = (local_600 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                bVar87 = local_600[0x1f] < '\0';
                if (((((((bVar95 || bVar96) || bVar94) || bVar93) || bVar92) || bVar91) || bVar89)
                    || bVar87) {
                  auVar160._8_4_ = 0x7f800000;
                  auVar160._0_8_ = 0x7f8000007f800000;
                  auVar160._12_4_ = 0x7f800000;
                  auVar160._16_4_ = 0x7f800000;
                  auVar160._20_4_ = 0x7f800000;
                  auVar160._24_4_ = 0x7f800000;
                  auVar160._28_4_ = 0x7f800000;
                  auVar133 = vblendvps_avx(auVar160,auVar147,auVar20);
                  auVar135 = vshufps_avx(auVar133,auVar133,0xb1);
                  auVar135 = vminps_avx(auVar133,auVar135);
                  auVar181 = vshufpd_avx(auVar135,auVar135,5);
                  auVar135 = vminps_avx(auVar135,auVar181);
                  auVar181 = vpermpd_avx2(auVar135,0x4e);
                  auVar135 = vminps_avx(auVar135,auVar181);
                  auVar135 = vcmpps_avx(auVar133,auVar135,0);
                  auVar181 = auVar20 & auVar135;
                  auVar133 = auVar20;
                  if ((((((((auVar181 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar181 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar181 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar181 >> 0x7f,0) != '\0') ||
                        (auVar181 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar181 >> 0xbf,0) != '\0') ||
                      (auVar181 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar181[0x1f] < '\0') {
                    auVar133 = vandps_avx(auVar135,auVar20);
                  }
                  uVar116 = vmovmskps_avx(auVar133);
                  uVar118 = 0;
                  for (; (uVar116 & 1) == 0; uVar116 = uVar116 >> 1 | 0x80000000) {
                    uVar118 = uVar118 + 1;
                  }
                  uVar117 = (ulong)uVar118;
                }
                local_600 = auVar20;
                auVar20 = auVar222._0_32_;
              } while (((((((bVar95 || bVar96) || bVar94) || bVar93) || bVar92) || bVar91) || bVar89
                       ) || bVar87);
            }
          }
        }
        local_620 = auVar20;
        local_640 = auVar147;
        local_680 = auVar242._0_32_;
      }
      auVar183 = ZEXT464((uint)fVar164);
      if (8 < iVar15) {
        uStack_6f8 = uVar236;
        local_700 = uVar124;
        uStack_6f0 = uVar237;
        uStack_6e8 = uVar238;
        local_240._4_4_ = iVar15;
        local_240._0_4_ = iVar15;
        local_240._8_4_ = iVar15;
        local_240._12_4_ = iVar15;
        local_240._16_4_ = iVar15;
        local_240._20_4_ = iVar15;
        local_240._24_4_ = iVar15;
        local_240._28_4_ = iVar15;
        local_180 = fVar164;
        fStack_17c = fVar164;
        fStack_178 = fVar164;
        fStack_174 = fVar164;
        fStack_170 = fVar164;
        fStack_16c = fVar164;
        fStack_168 = fVar164;
        fStack_164 = fVar164;
        local_1a0 = local_720._0_4_;
        uStack_19c = local_720._0_4_;
        uStack_198 = local_720._0_4_;
        uStack_194 = local_720._0_4_;
        uStack_190 = local_720._0_4_;
        uStack_18c = local_720._0_4_;
        uStack_188 = local_720._0_4_;
        uStack_184 = local_720._0_4_;
        local_1c0 = 1.0 / (float)local_580._0_4_;
        fStack_1bc = local_1c0;
        fStack_1b8 = local_1c0;
        fStack_1b4 = local_1c0;
        fStack_1b0 = local_1c0;
        fStack_1ac = local_1c0;
        fStack_1a8 = local_1c0;
        fStack_1a4 = local_1c0;
        local_200 = uVar13;
        uStack_1fc = uVar13;
        uStack_1f8 = uVar13;
        uStack_1f4 = uVar13;
        local_210 = uVar14;
        uStack_20c = uVar14;
        uStack_208 = uVar14;
        uStack_204 = uVar14;
        lVar120 = 8;
        do {
          auVar147 = *(undefined1 (*) [32])(bspline_basis0 + lVar120 * 4 + lVar22);
          auVar20 = *(undefined1 (*) [32])(lVar22 + 0x222bfac + lVar120 * 4);
          auVar133 = *(undefined1 (*) [32])(lVar22 + 0x222c430 + lVar120 * 4);
          pauVar2 = (undefined1 (*) [32])(lVar22 + 0x222c8b4 + lVar120 * 4);
          fVar143 = *(float *)*pauVar2;
          fVar231 = *(float *)(*pauVar2 + 4);
          fVar235 = *(float *)(*pauVar2 + 8);
          fVar97 = *(float *)(*pauVar2 + 0xc);
          fVar98 = *(float *)(*pauVar2 + 0x10);
          fVar99 = *(float *)(*pauVar2 + 0x14);
          fVar100 = *(float *)(*pauVar2 + 0x18);
          auVar114 = *(undefined1 (*) [28])*pauVar2;
          auVar243._0_4_ = fVar143 * fVar230;
          auVar243._4_4_ = fVar231 * fVar161;
          auVar243._8_4_ = fVar235 * fVar244;
          auVar243._12_4_ = fVar97 * fVar247;
          auVar243._16_4_ = fVar98 * fVar248;
          auVar243._20_4_ = fVar99 * fVar249;
          auVar243._28_36_ = auVar242._28_36_;
          auVar243._24_4_ = fVar100 * fVar250;
          auVar222._0_4_ = fVar162 * fVar143;
          auVar222._4_4_ = fVar184 * fVar231;
          auVar222._8_4_ = fVar251 * fVar235;
          auVar222._12_4_ = fVar252 * fVar97;
          auVar222._16_4_ = fVar226 * fVar98;
          auVar222._20_4_ = fVar227 * fVar99;
          auVar222._28_36_ = auVar183._28_36_;
          auVar222._24_4_ = fVar228 * fVar100;
          auVar194 = vfmadd231ps_fma(auVar243._0_32_,auVar133,local_6e0);
          auVar187 = vfmadd231ps_fma(auVar222._0_32_,auVar133,auVar246._0_32_);
          auVar194 = vfmadd231ps_fma(ZEXT1632(auVar194),auVar20,auVar255._0_32_);
          auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar20,local_4a0);
          auVar194 = vfmadd231ps_fma(ZEXT1632(auVar194),auVar147,auVar215._0_32_);
          auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar147,local_4c0);
          auVar135 = *(undefined1 (*) [32])(bspline_basis1 + lVar120 * 4 + lVar22);
          auVar181 = *(undefined1 (*) [32])(lVar22 + 0x222e3cc + lVar120 * 4);
          auVar221 = *(undefined1 (*) [32])(lVar22 + 0x222e850 + lVar120 * 4);
          pfVar1 = (float *)(lVar22 + 0x222ecd4 + lVar120 * 4);
          fVar101 = *pfVar1;
          fVar102 = pfVar1[1];
          fVar103 = pfVar1[2];
          fVar104 = pfVar1[3];
          fVar105 = pfVar1[4];
          fVar106 = pfVar1[5];
          fVar107 = pfVar1[6];
          auVar183._0_4_ = fVar101 * fVar230;
          auVar183._4_4_ = fVar102 * fVar161;
          auVar183._8_4_ = fVar103 * fVar244;
          auVar183._12_4_ = fVar104 * fVar247;
          auVar183._16_4_ = fVar105 * fVar248;
          auVar183._20_4_ = fVar106 * fVar249;
          auVar183._28_36_ = auVar215._28_36_;
          auVar183._24_4_ = fVar107 * fVar250;
          auVar56._4_4_ = fVar102 * fVar184;
          auVar56._0_4_ = fVar101 * fVar162;
          auVar56._8_4_ = fVar103 * fVar251;
          auVar56._12_4_ = fVar104 * fVar252;
          auVar56._16_4_ = fVar105 * fVar226;
          auVar56._20_4_ = fVar106 * fVar227;
          auVar56._24_4_ = fVar107 * fVar228;
          auVar56._28_4_ = fVar229;
          auVar6 = vfmadd231ps_fma(auVar183._0_32_,auVar221,local_6e0);
          auVar7 = vfmadd231ps_fma(auVar56,auVar221,auVar246._0_32_);
          auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar181,auVar255._0_32_);
          auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar181,local_4a0);
          auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar135,auVar215._0_32_);
          auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar135,local_4c0);
          local_560 = ZEXT1632(auVar6);
          auVar149 = ZEXT1632(auVar194);
          local_520 = vsubps_avx(local_560,auVar149);
          auVar127 = ZEXT1632(auVar7);
          local_720 = ZEXT1632(auVar187);
          auVar19 = vsubps_avx(auVar127,local_720);
          auVar90._4_4_ = auVar187._4_4_ * local_520._4_4_;
          auVar90._0_4_ = auVar187._0_4_ * local_520._0_4_;
          auVar90._8_4_ = auVar187._8_4_ * local_520._8_4_;
          auVar90._12_4_ = auVar187._12_4_ * local_520._12_4_;
          auVar90._16_4_ = local_520._16_4_ * 0.0;
          auVar90._20_4_ = local_520._20_4_ * 0.0;
          auVar90._24_4_ = local_520._24_4_ * 0.0;
          auVar90._28_4_ = local_4c0._28_4_;
          fVar164 = auVar19._0_4_;
          fVar163 = auVar19._4_4_;
          auVar88._4_4_ = auVar194._4_4_ * fVar163;
          auVar88._0_4_ = auVar194._0_4_ * fVar164;
          fVar138 = auVar19._8_4_;
          auVar88._8_4_ = auVar194._8_4_ * fVar138;
          fVar139 = auVar19._12_4_;
          auVar88._12_4_ = auVar194._12_4_ * fVar139;
          fVar140 = auVar19._16_4_;
          auVar88._16_4_ = fVar140 * 0.0;
          fVar141 = auVar19._20_4_;
          auVar88._20_4_ = fVar141 * 0.0;
          fVar142 = auVar19._24_4_;
          auVar88._24_4_ = fVar142 * 0.0;
          auVar88._28_4_ = local_6e0._28_4_;
          auVar180 = vsubps_avx(auVar90,auVar88);
          auVar57._4_4_ = fVar231 * local_100._4_4_;
          auVar57._0_4_ = fVar143 * (float)local_100;
          auVar57._8_4_ = fVar235 * (float)uStack_f8;
          auVar57._12_4_ = fVar97 * uStack_f8._4_4_;
          auVar57._16_4_ = fVar98 * (float)uStack_f0;
          auVar57._20_4_ = fVar99 * uStack_f0._4_4_;
          auVar57._24_4_ = fVar100 * (float)uStack_e8;
          auVar57._28_4_ = local_6e0._28_4_;
          auVar242 = ZEXT3264(local_e0);
          auVar194 = vfmadd231ps_fma(auVar57,local_e0,auVar133);
          auVar194 = vfmadd231ps_fma(ZEXT1632(auVar194),local_c0,auVar20);
          auVar194 = vfmadd231ps_fma(ZEXT1632(auVar194),local_a0,auVar147);
          auVar58._4_4_ = fVar102 * local_100._4_4_;
          auVar58._0_4_ = fVar101 * (float)local_100;
          auVar58._8_4_ = fVar103 * (float)uStack_f8;
          auVar58._12_4_ = fVar104 * uStack_f8._4_4_;
          auVar58._16_4_ = fVar105 * (float)uStack_f0;
          auVar58._20_4_ = fVar106 * uStack_f0._4_4_;
          auVar58._24_4_ = fVar107 * (float)uStack_e8;
          auVar58._28_4_ = uStack_e8._4_4_;
          auVar187 = vfmadd231ps_fma(auVar58,auVar221,local_e0);
          auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar181,local_c0);
          auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar135,local_a0);
          auVar183 = ZEXT1664(auVar187);
          auVar59._4_4_ = fVar163 * fVar163;
          auVar59._0_4_ = fVar164 * fVar164;
          auVar59._8_4_ = fVar138 * fVar138;
          auVar59._12_4_ = fVar139 * fVar139;
          auVar59._16_4_ = fVar140 * fVar140;
          auVar59._20_4_ = fVar141 * fVar141;
          auVar59._24_4_ = fVar142 * fVar142;
          auVar59._28_4_ = *(undefined4 *)(*pauVar2 + 0x1c);
          auVar6 = vfmadd231ps_fma(auVar59,local_520,local_520);
          auVar156 = ZEXT1632(auVar194);
          local_4e0 = ZEXT1632(auVar187);
          auVar213 = vmaxps_avx(auVar156,local_4e0);
          auVar219._0_4_ = auVar213._0_4_ * auVar213._0_4_ * auVar6._0_4_;
          auVar219._4_4_ = auVar213._4_4_ * auVar213._4_4_ * auVar6._4_4_;
          auVar219._8_4_ = auVar213._8_4_ * auVar213._8_4_ * auVar6._8_4_;
          auVar219._12_4_ = auVar213._12_4_ * auVar213._12_4_ * auVar6._12_4_;
          auVar219._16_4_ = auVar213._16_4_ * auVar213._16_4_ * 0.0;
          auVar219._20_4_ = auVar213._20_4_ * auVar213._20_4_ * 0.0;
          auVar219._24_4_ = auVar213._24_4_ * auVar213._24_4_ * 0.0;
          auVar219._28_4_ = 0;
          auVar60._4_4_ = auVar180._4_4_ * auVar180._4_4_;
          auVar60._0_4_ = auVar180._0_4_ * auVar180._0_4_;
          auVar60._8_4_ = auVar180._8_4_ * auVar180._8_4_;
          auVar60._12_4_ = auVar180._12_4_ * auVar180._12_4_;
          auVar60._16_4_ = auVar180._16_4_ * auVar180._16_4_;
          auVar60._20_4_ = auVar180._20_4_ * auVar180._20_4_;
          auVar60._24_4_ = auVar180._24_4_ * auVar180._24_4_;
          auVar60._28_4_ = auVar180._28_4_;
          auVar213 = vcmpps_avx(auVar60,auVar219,2);
          local_360 = (int)lVar120;
          auVar220._4_4_ = local_360;
          auVar220._0_4_ = local_360;
          auVar220._8_4_ = local_360;
          auVar220._12_4_ = local_360;
          auVar220._16_4_ = local_360;
          auVar220._20_4_ = local_360;
          auVar220._24_4_ = local_360;
          auVar220._28_4_ = local_360;
          auVar180 = vpor_avx2(auVar220,_DAT_0205a920);
          auVar21 = vpcmpgtd_avx2(local_240,auVar180);
          auVar180 = auVar21 & auVar213;
          fVar230 = local_780;
          fVar161 = fStack_77c;
          fVar244 = fStack_778;
          fVar247 = fStack_774;
          fVar248 = fStack_770;
          fVar249 = fStack_76c;
          fVar250 = fStack_768;
          fVar162 = (float)local_820;
          fVar184 = local_820._4_4_;
          fVar251 = (float)uStack_818;
          fVar252 = uStack_818._4_4_;
          fVar226 = (float)uStack_810;
          fVar227 = uStack_810._4_4_;
          fVar228 = (float)uStack_808;
          fVar229 = uStack_808._4_4_;
          if ((((((((auVar180 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar180 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar180 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar180 >> 0x7f,0) == '\0') &&
                (auVar180 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar180 >> 0xbf,0) == '\0') &&
              (auVar180 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar180[0x1f]) {
LAB_01964b20:
            auVar255 = ZEXT3264(local_840);
            auVar246 = ZEXT3264(local_800);
            auVar215 = ZEXT3264(local_7e0);
          }
          else {
            local_120 = vandps_avx(auVar21,auVar213);
            auVar61._4_4_ = local_700._4_4_ * fVar102;
            auVar61._0_4_ = (float)local_700 * fVar101;
            auVar61._8_4_ = (float)uStack_6f8 * fVar103;
            auVar61._12_4_ = uStack_6f8._4_4_ * fVar104;
            auVar61._16_4_ = (float)uStack_6f0 * fVar105;
            auVar61._20_4_ = uStack_6f0._4_4_ * fVar106;
            auVar61._24_4_ = (float)uStack_6e8 * fVar107;
            auVar61._28_4_ = auVar213._28_4_;
            auVar194 = vfmadd213ps_fma(auVar221,local_480,auVar61);
            auVar194 = vfmadd213ps_fma(auVar181,local_680,ZEXT1632(auVar194));
            auVar194 = vfmadd213ps_fma(auVar135,local_5a0,ZEXT1632(auVar194));
            local_140 = ZEXT1632(auVar194);
            local_540._0_4_ = auVar114._0_4_;
            local_540._4_4_ = auVar114._4_4_;
            fStack_538 = auVar114._8_4_;
            fStack_534 = auVar114._12_4_;
            fStack_530 = auVar114._16_4_;
            fStack_52c = auVar114._20_4_;
            fStack_528 = auVar114._24_4_;
            auVar62._4_4_ = local_700._4_4_ * (float)local_540._4_4_;
            auVar62._0_4_ = (float)local_700 * (float)local_540._0_4_;
            auVar62._8_4_ = (float)uStack_6f8 * fStack_538;
            auVar62._12_4_ = uStack_6f8._4_4_ * fStack_534;
            auVar62._16_4_ = (float)uStack_6f0 * fStack_530;
            auVar62._20_4_ = uStack_6f0._4_4_ * fStack_52c;
            auVar62._24_4_ = (float)uStack_6e8 * fStack_528;
            auVar62._28_4_ = auVar213._28_4_;
            auVar194 = vfmadd213ps_fma(auVar133,local_480,auVar62);
            auVar194 = vfmadd213ps_fma(auVar20,local_680,ZEXT1632(auVar194));
            auVar20 = *(undefined1 (*) [32])(lVar22 + 0x222cd38 + lVar120 * 4);
            auVar133 = *(undefined1 (*) [32])(lVar22 + 0x222d1bc + lVar120 * 4);
            auVar135 = *(undefined1 (*) [32])(lVar22 + 0x222d640 + lVar120 * 4);
            pfVar3 = (float *)(lVar22 + 0x222dac4 + lVar120 * 4);
            fVar164 = *pfVar3;
            fVar163 = pfVar3[1];
            fVar138 = pfVar3[2];
            fVar139 = pfVar3[3];
            fVar140 = pfVar3[4];
            fVar141 = pfVar3[5];
            fVar142 = pfVar3[6];
            auVar63._4_4_ = fVar163 * fStack_77c;
            auVar63._0_4_ = fVar164 * local_780;
            auVar63._8_4_ = fVar138 * fStack_778;
            auVar63._12_4_ = fVar139 * fStack_774;
            auVar63._16_4_ = fVar140 * fStack_770;
            auVar63._20_4_ = fVar141 * fStack_76c;
            auVar63._24_4_ = fVar142 * fStack_768;
            auVar63._28_4_ = pfVar1[7];
            auVar233._0_4_ = (float)local_820 * fVar164;
            auVar233._4_4_ = local_820._4_4_ * fVar163;
            auVar233._8_4_ = (float)uStack_818 * fVar138;
            auVar233._12_4_ = uStack_818._4_4_ * fVar139;
            auVar233._16_4_ = (float)uStack_810 * fVar140;
            auVar233._20_4_ = uStack_810._4_4_ * fVar141;
            auVar233._24_4_ = (float)uStack_808 * fVar142;
            auVar233._28_4_ = 0;
            auVar64._4_4_ = fVar163 * local_700._4_4_;
            auVar64._0_4_ = fVar164 * (float)local_700;
            auVar64._8_4_ = fVar138 * (float)uStack_6f8;
            auVar64._12_4_ = fVar139 * uStack_6f8._4_4_;
            auVar64._16_4_ = fVar140 * (float)uStack_6f0;
            auVar64._20_4_ = fVar141 * uStack_6f0._4_4_;
            auVar64._24_4_ = fVar142 * (float)uStack_6e8;
            auVar64._28_4_ = pfVar3[7];
            auVar187 = vfmadd231ps_fma(auVar63,auVar135,local_6e0);
            auVar6 = vfmadd231ps_fma(auVar233,auVar135,local_800);
            auVar7 = vfmadd231ps_fma(auVar64,local_480,auVar135);
            auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar133,local_840);
            auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar133,local_4a0);
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),local_680,auVar133);
            auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar20,local_7e0);
            auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar20,local_4c0);
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),local_5a0,auVar20);
            pfVar1 = (float *)(lVar22 + 0x222fee4 + lVar120 * 4);
            fVar164 = *pfVar1;
            fVar163 = pfVar1[1];
            fVar138 = pfVar1[2];
            fVar139 = pfVar1[3];
            fVar140 = pfVar1[4];
            fVar141 = pfVar1[5];
            fVar142 = pfVar1[6];
            auVar65._4_4_ = fStack_77c * fVar163;
            auVar65._0_4_ = local_780 * fVar164;
            auVar65._8_4_ = fStack_778 * fVar138;
            auVar65._12_4_ = fStack_774 * fVar139;
            auVar65._16_4_ = fStack_770 * fVar140;
            auVar65._20_4_ = fStack_76c * fVar141;
            auVar65._24_4_ = fStack_768 * fVar142;
            auVar65._28_4_ = local_5a0._28_4_;
            auVar66._4_4_ = local_820._4_4_ * fVar163;
            auVar66._0_4_ = (float)local_820 * fVar164;
            auVar66._8_4_ = (float)uStack_818 * fVar138;
            auVar66._12_4_ = uStack_818._4_4_ * fVar139;
            auVar66._16_4_ = (float)uStack_810 * fVar140;
            auVar66._20_4_ = uStack_810._4_4_ * fVar141;
            auVar66._24_4_ = (float)uStack_808 * fVar142;
            auVar66._28_4_ = uStack_808._4_4_;
            auVar67._4_4_ = local_700._4_4_ * fVar163;
            auVar67._0_4_ = (float)local_700 * fVar164;
            auVar67._8_4_ = (float)uStack_6f8 * fVar138;
            auVar67._12_4_ = uStack_6f8._4_4_ * fVar139;
            auVar67._16_4_ = (float)uStack_6f0 * fVar140;
            auVar67._20_4_ = uStack_6f0._4_4_ * fVar141;
            auVar67._24_4_ = (float)uStack_6e8 * fVar142;
            auVar67._28_4_ = pfVar1[7];
            auVar20 = *(undefined1 (*) [32])(lVar22 + 0x222fa60 + lVar120 * 4);
            auVar207 = vfmadd231ps_fma(auVar65,auVar20,local_6e0);
            auVar9 = vfmadd231ps_fma(auVar66,auVar20,local_800);
            auVar10 = vfmadd231ps_fma(auVar67,local_480,auVar20);
            auVar20 = *(undefined1 (*) [32])(lVar22 + 0x222f5dc + lVar120 * 4);
            auVar207 = vfmadd231ps_fma(ZEXT1632(auVar207),auVar20,local_840);
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar20,local_4a0);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar20,local_680);
            auVar20 = *(undefined1 (*) [32])(lVar22 + 0x222f158 + lVar120 * 4);
            auVar207 = vfmadd231ps_fma(ZEXT1632(auVar207),auVar20,local_7e0);
            auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar20,local_4c0);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),local_5a0,auVar20);
            auVar20 = vandps_avx(ZEXT1632(auVar187),local_1e0);
            auVar133 = vandps_avx(ZEXT1632(auVar6),local_1e0);
            auVar133 = vmaxps_avx(auVar20,auVar133);
            auVar20 = vandps_avx(ZEXT1632(auVar7),local_1e0);
            auVar20 = vmaxps_avx(auVar133,auVar20);
            auVar113._4_4_ = fStack_17c;
            auVar113._0_4_ = local_180;
            auVar113._8_4_ = fStack_178;
            auVar113._12_4_ = fStack_174;
            auVar113._16_4_ = fStack_170;
            auVar113._20_4_ = fStack_16c;
            auVar113._24_4_ = fStack_168;
            auVar113._28_4_ = fStack_164;
            auVar20 = vcmpps_avx(auVar20,auVar113,1);
            auVar135 = vblendvps_avx(ZEXT1632(auVar187),local_520,auVar20);
            auVar181 = vblendvps_avx(ZEXT1632(auVar6),auVar19,auVar20);
            auVar20 = vandps_avx(ZEXT1632(auVar207),local_1e0);
            auVar133 = vandps_avx(ZEXT1632(auVar9),local_1e0);
            auVar133 = vmaxps_avx(auVar20,auVar133);
            auVar20 = vandps_avx(local_1e0,ZEXT1632(auVar10));
            auVar20 = vmaxps_avx(auVar133,auVar20);
            auVar133 = vcmpps_avx(auVar20,auVar113,1);
            auVar20 = vblendvps_avx(ZEXT1632(auVar207),local_520,auVar133);
            auVar133 = vblendvps_avx(ZEXT1632(auVar9),auVar19,auVar133);
            auVar194 = vfmadd213ps_fma(auVar147,local_5a0,ZEXT1632(auVar194));
            auVar187 = vfmadd213ps_fma(auVar135,auVar135,ZEXT832(0) << 0x20);
            auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar181,auVar181);
            auVar147 = vrsqrtps_avx(ZEXT1632(auVar187));
            fVar164 = auVar147._0_4_;
            fVar163 = auVar147._4_4_;
            fVar138 = auVar147._8_4_;
            fVar139 = auVar147._12_4_;
            fVar140 = auVar147._16_4_;
            fVar141 = auVar147._20_4_;
            fVar142 = auVar147._24_4_;
            auVar68._4_4_ = fVar163 * fVar163 * fVar163 * auVar187._4_4_ * -0.5;
            auVar68._0_4_ = fVar164 * fVar164 * fVar164 * auVar187._0_4_ * -0.5;
            auVar68._8_4_ = fVar138 * fVar138 * fVar138 * auVar187._8_4_ * -0.5;
            auVar68._12_4_ = fVar139 * fVar139 * fVar139 * auVar187._12_4_ * -0.5;
            auVar68._16_4_ = fVar140 * fVar140 * fVar140 * -0.0;
            auVar68._20_4_ = fVar141 * fVar141 * fVar141 * -0.0;
            auVar68._24_4_ = fVar142 * fVar142 * fVar142 * -0.0;
            auVar68._28_4_ = 0;
            auVar245._8_4_ = 0x3fc00000;
            auVar245._0_8_ = 0x3fc000003fc00000;
            auVar245._12_4_ = 0x3fc00000;
            auVar245._16_4_ = 0x3fc00000;
            auVar245._20_4_ = 0x3fc00000;
            auVar245._24_4_ = 0x3fc00000;
            auVar245._28_4_ = 0x3fc00000;
            auVar187 = vfmadd231ps_fma(auVar68,auVar245,auVar147);
            fVar164 = auVar187._0_4_;
            fVar163 = auVar187._4_4_;
            auVar69._4_4_ = auVar181._4_4_ * fVar163;
            auVar69._0_4_ = auVar181._0_4_ * fVar164;
            fVar138 = auVar187._8_4_;
            auVar69._8_4_ = auVar181._8_4_ * fVar138;
            fVar139 = auVar187._12_4_;
            auVar69._12_4_ = auVar181._12_4_ * fVar139;
            auVar69._16_4_ = auVar181._16_4_ * 0.0;
            auVar69._20_4_ = auVar181._20_4_ * 0.0;
            auVar69._24_4_ = auVar181._24_4_ * 0.0;
            auVar69._28_4_ = auVar181._28_4_;
            auVar70._4_4_ = fVar163 * -auVar135._4_4_;
            auVar70._0_4_ = fVar164 * -auVar135._0_4_;
            auVar70._8_4_ = fVar138 * -auVar135._8_4_;
            auVar70._12_4_ = fVar139 * -auVar135._12_4_;
            auVar70._16_4_ = -auVar135._16_4_ * 0.0;
            auVar70._20_4_ = -auVar135._20_4_ * 0.0;
            auVar70._24_4_ = -auVar135._24_4_ * 0.0;
            auVar70._28_4_ = auVar147._28_4_;
            auVar187 = vfmadd213ps_fma(auVar20,auVar20,ZEXT832(0) << 0x20);
            auVar187 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar133,auVar133);
            auVar147 = vrsqrtps_avx(ZEXT1632(auVar187));
            auVar71._28_4_ = local_4c0._28_4_;
            auVar71._0_28_ =
                 ZEXT1628(CONCAT412(fVar139 * 0.0,
                                    CONCAT48(fVar138 * 0.0,CONCAT44(fVar163 * 0.0,fVar164 * 0.0))));
            fVar164 = auVar147._0_4_;
            fVar163 = auVar147._4_4_;
            fVar138 = auVar147._8_4_;
            fVar139 = auVar147._12_4_;
            fVar140 = auVar147._16_4_;
            fVar141 = auVar147._20_4_;
            fVar142 = auVar147._24_4_;
            auVar72._4_4_ = fVar163 * fVar163 * fVar163 * auVar187._4_4_ * -0.5;
            auVar72._0_4_ = fVar164 * fVar164 * fVar164 * auVar187._0_4_ * -0.5;
            auVar72._8_4_ = fVar138 * fVar138 * fVar138 * auVar187._8_4_ * -0.5;
            auVar72._12_4_ = fVar139 * fVar139 * fVar139 * auVar187._12_4_ * -0.5;
            auVar72._16_4_ = fVar140 * fVar140 * fVar140 * -0.0;
            auVar72._20_4_ = fVar141 * fVar141 * fVar141 * -0.0;
            auVar72._24_4_ = fVar142 * fVar142 * fVar142 * -0.0;
            auVar72._28_4_ = 0;
            auVar187 = vfmadd231ps_fma(auVar72,auVar245,auVar147);
            fVar164 = auVar187._0_4_;
            fVar163 = auVar187._4_4_;
            auVar73._4_4_ = auVar133._4_4_ * fVar163;
            auVar73._0_4_ = auVar133._0_4_ * fVar164;
            fVar138 = auVar187._8_4_;
            auVar73._8_4_ = auVar133._8_4_ * fVar138;
            fVar139 = auVar187._12_4_;
            auVar73._12_4_ = auVar133._12_4_ * fVar139;
            auVar73._16_4_ = auVar133._16_4_ * 0.0;
            auVar73._20_4_ = auVar133._20_4_ * 0.0;
            auVar73._24_4_ = auVar133._24_4_ * 0.0;
            auVar73._28_4_ = 0;
            auVar74._4_4_ = fVar163 * -auVar20._4_4_;
            auVar74._0_4_ = fVar164 * -auVar20._0_4_;
            auVar74._8_4_ = fVar138 * -auVar20._8_4_;
            auVar74._12_4_ = fVar139 * -auVar20._12_4_;
            auVar74._16_4_ = -auVar20._16_4_ * 0.0;
            auVar74._20_4_ = -auVar20._20_4_ * 0.0;
            auVar74._24_4_ = -auVar20._24_4_ * 0.0;
            auVar74._28_4_ = auVar147._28_4_;
            auVar75._28_4_ = 0xbf000000;
            auVar75._0_28_ =
                 ZEXT1628(CONCAT412(fVar139 * 0.0,
                                    CONCAT48(fVar138 * 0.0,CONCAT44(fVar163 * 0.0,fVar164 * 0.0))));
            auVar187 = vfmadd213ps_fma(auVar69,auVar156,auVar149);
            auVar6 = vfmadd213ps_fma(auVar70,auVar156,local_720);
            auVar7 = vfmadd213ps_fma(auVar71,auVar156,ZEXT1632(auVar194));
            auVar125 = vfnmadd213ps_fma(auVar69,auVar156,auVar149);
            auVar207 = vfmadd213ps_fma(auVar73,local_4e0,local_560);
            auVar166 = vfnmadd213ps_fma(auVar70,auVar156,local_720);
            auVar9 = vfmadd213ps_fma(auVar74,local_4e0,auVar127);
            auVar194 = vfnmadd231ps_fma(ZEXT1632(auVar194),auVar156,auVar71);
            auVar10 = vfmadd213ps_fma(auVar75,local_4e0,local_140);
            auVar23 = vfnmadd213ps_fma(auVar73,local_4e0,local_560);
            auVar126 = vfnmadd213ps_fma(auVar74,local_4e0,auVar127);
            auVar167 = vfnmadd231ps_fma(local_140,local_4e0,auVar75);
            auVar147 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar166));
            auVar20 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar194));
            auVar76._4_4_ = auVar147._4_4_ * auVar194._4_4_;
            auVar76._0_4_ = auVar147._0_4_ * auVar194._0_4_;
            auVar76._8_4_ = auVar147._8_4_ * auVar194._8_4_;
            auVar76._12_4_ = auVar147._12_4_ * auVar194._12_4_;
            auVar76._16_4_ = auVar147._16_4_ * 0.0;
            auVar76._20_4_ = auVar147._20_4_ * 0.0;
            auVar76._24_4_ = auVar147._24_4_ * 0.0;
            auVar76._28_4_ = local_520._28_4_;
            auVar11 = vfmsub231ps_fma(auVar76,ZEXT1632(auVar166),auVar20);
            auVar77._4_4_ = auVar125._4_4_ * auVar20._4_4_;
            auVar77._0_4_ = auVar125._0_4_ * auVar20._0_4_;
            auVar77._8_4_ = auVar125._8_4_ * auVar20._8_4_;
            auVar77._12_4_ = auVar125._12_4_ * auVar20._12_4_;
            auVar77._16_4_ = auVar20._16_4_ * 0.0;
            auVar77._20_4_ = auVar20._20_4_ * 0.0;
            auVar77._24_4_ = auVar20._24_4_ * 0.0;
            auVar77._28_4_ = auVar20._28_4_;
            auVar221 = ZEXT1632(auVar125);
            auVar20 = vsubps_avx(ZEXT1632(auVar207),auVar221);
            auVar180 = ZEXT1632(auVar194);
            auVar194 = vfmsub231ps_fma(auVar77,auVar180,auVar20);
            auVar78._4_4_ = auVar166._4_4_ * auVar20._4_4_;
            auVar78._0_4_ = auVar166._0_4_ * auVar20._0_4_;
            auVar78._8_4_ = auVar166._8_4_ * auVar20._8_4_;
            auVar78._12_4_ = auVar166._12_4_ * auVar20._12_4_;
            auVar78._16_4_ = auVar20._16_4_ * 0.0;
            auVar78._20_4_ = auVar20._20_4_ * 0.0;
            auVar78._24_4_ = auVar20._24_4_ * 0.0;
            auVar78._28_4_ = auVar20._28_4_;
            auVar125 = vfmsub231ps_fma(auVar78,auVar221,auVar147);
            auVar194 = vfmadd231ps_fma(ZEXT1632(auVar125),ZEXT832(0) << 0x20,ZEXT1632(auVar194));
            auVar194 = vfmadd231ps_fma(ZEXT1632(auVar194),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
            auVar21 = vcmpps_avx(ZEXT1632(auVar194),ZEXT832(0) << 0x20,2);
            auVar147 = vblendvps_avx(ZEXT1632(auVar23),ZEXT1632(auVar187),auVar21);
            auVar20 = vblendvps_avx(ZEXT1632(auVar126),ZEXT1632(auVar6),auVar21);
            local_720 = vblendvps_avx(ZEXT1632(auVar167),ZEXT1632(auVar7),auVar21);
            auVar133 = vblendvps_avx(auVar221,ZEXT1632(auVar207),auVar21);
            auVar135 = vblendvps_avx(ZEXT1632(auVar166),ZEXT1632(auVar9),auVar21);
            auVar181 = vblendvps_avx(auVar180,ZEXT1632(auVar10),auVar21);
            auVar221 = vblendvps_avx(ZEXT1632(auVar207),auVar221,auVar21);
            auVar213 = vblendvps_avx(ZEXT1632(auVar9),ZEXT1632(auVar166),auVar21);
            auVar194 = vpackssdw_avx(local_120._0_16_,local_120._16_16_);
            auVar180 = vblendvps_avx(ZEXT1632(auVar10),auVar180,auVar21);
            auVar221 = vsubps_avx(auVar221,auVar147);
            auVar207 = auVar221._0_16_;
            auVar213 = vsubps_avx(auVar213,auVar20);
            auVar127 = vsubps_avx(auVar180,local_720);
            auVar149 = vsubps_avx(auVar147,auVar133);
            auVar177 = vsubps_avx(auVar20,auVar135);
            auVar188 = vsubps_avx(local_720,auVar181);
            auVar242 = ZEXT3264(auVar188);
            auVar202._0_4_ = auVar127._0_4_ * auVar147._0_4_;
            auVar202._4_4_ = auVar127._4_4_ * auVar147._4_4_;
            auVar202._8_4_ = auVar127._8_4_ * auVar147._8_4_;
            auVar202._12_4_ = auVar127._12_4_ * auVar147._12_4_;
            auVar202._16_4_ = auVar127._16_4_ * auVar147._16_4_;
            auVar202._20_4_ = auVar127._20_4_ * auVar147._20_4_;
            auVar202._24_4_ = auVar127._24_4_ * auVar147._24_4_;
            auVar202._28_4_ = 0;
            auVar187 = vfmsub231ps_fma(auVar202,local_720,auVar221);
            auVar79._4_4_ = auVar221._4_4_ * auVar20._4_4_;
            auVar79._0_4_ = auVar221._0_4_ * auVar20._0_4_;
            auVar79._8_4_ = auVar221._8_4_ * auVar20._8_4_;
            auVar79._12_4_ = auVar221._12_4_ * auVar20._12_4_;
            auVar79._16_4_ = auVar221._16_4_ * auVar20._16_4_;
            auVar79._20_4_ = auVar221._20_4_ * auVar20._20_4_;
            auVar79._24_4_ = auVar221._24_4_ * auVar20._24_4_;
            auVar79._28_4_ = auVar180._28_4_;
            auVar6 = vfmsub231ps_fma(auVar79,auVar147,auVar213);
            auVar187 = vfmadd231ps_fma(ZEXT1632(auVar6),ZEXT1632((undefined1  [16])0x0),
                                       ZEXT1632(auVar187));
            auVar203._0_4_ = auVar213._0_4_ * local_720._0_4_;
            auVar203._4_4_ = auVar213._4_4_ * local_720._4_4_;
            auVar203._8_4_ = auVar213._8_4_ * local_720._8_4_;
            auVar203._12_4_ = auVar213._12_4_ * local_720._12_4_;
            auVar203._16_4_ = auVar213._16_4_ * local_720._16_4_;
            auVar203._20_4_ = auVar213._20_4_ * local_720._20_4_;
            auVar203._24_4_ = auVar213._24_4_ * local_720._24_4_;
            auVar203._28_4_ = 0;
            auVar6 = vfmsub231ps_fma(auVar203,auVar20,auVar127);
            auVar6 = vfmadd231ps_fma(ZEXT1632(auVar187),ZEXT1632((undefined1  [16])0x0),
                                     ZEXT1632(auVar6));
            auVar183 = ZEXT1664(auVar6);
            auVar204._0_4_ = auVar188._0_4_ * auVar133._0_4_;
            auVar204._4_4_ = auVar188._4_4_ * auVar133._4_4_;
            auVar204._8_4_ = auVar188._8_4_ * auVar133._8_4_;
            auVar204._12_4_ = auVar188._12_4_ * auVar133._12_4_;
            auVar204._16_4_ = auVar188._16_4_ * auVar133._16_4_;
            auVar204._20_4_ = auVar188._20_4_ * auVar133._20_4_;
            auVar204._24_4_ = auVar188._24_4_ * auVar133._24_4_;
            auVar204._28_4_ = 0;
            auVar187 = vfmsub231ps_fma(auVar204,auVar149,auVar181);
            auVar80._4_4_ = auVar177._4_4_ * auVar181._4_4_;
            auVar80._0_4_ = auVar177._0_4_ * auVar181._0_4_;
            auVar80._8_4_ = auVar177._8_4_ * auVar181._8_4_;
            auVar80._12_4_ = auVar177._12_4_ * auVar181._12_4_;
            auVar80._16_4_ = auVar177._16_4_ * auVar181._16_4_;
            auVar80._20_4_ = auVar177._20_4_ * auVar181._20_4_;
            auVar80._24_4_ = auVar177._24_4_ * auVar181._24_4_;
            auVar80._28_4_ = auVar147._28_4_;
            auVar7 = vfmsub231ps_fma(auVar80,auVar135,auVar188);
            auVar81._4_4_ = auVar149._4_4_ * auVar135._4_4_;
            auVar81._0_4_ = auVar149._0_4_ * auVar135._0_4_;
            auVar81._8_4_ = auVar149._8_4_ * auVar135._8_4_;
            auVar81._12_4_ = auVar149._12_4_ * auVar135._12_4_;
            auVar81._16_4_ = auVar149._16_4_ * auVar135._16_4_;
            auVar81._20_4_ = auVar149._20_4_ * auVar135._20_4_;
            auVar81._24_4_ = auVar149._24_4_ * auVar135._24_4_;
            auVar81._28_4_ = auVar135._28_4_;
            auVar9 = vfmsub231ps_fma(auVar81,auVar177,auVar133);
            auVar135 = ZEXT1632((undefined1  [16])0x0);
            auVar187 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar135,ZEXT1632(auVar187));
            auVar7 = vfmadd231ps_fma(ZEXT1632(auVar187),auVar135,ZEXT1632(auVar7));
            auVar133 = vmaxps_avx(ZEXT1632(auVar6),ZEXT1632(auVar7));
            auVar133 = vcmpps_avx(auVar133,auVar135,2);
            auVar187 = vpackssdw_avx(auVar133._0_16_,auVar133._16_16_);
            auVar194 = vpand_avx(auVar187,auVar194);
            auVar133 = vpmovsxwd_avx2(auVar194);
            if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar133 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar133 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar133 >> 0x7f,0) == '\0') &&
                  (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar133 >> 0xbf,0) == '\0') &&
                (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar133[0x1f]) {
LAB_01964e6a:
              auVar190._8_8_ = uStack_5b8;
              auVar190._0_8_ = local_5c0;
              auVar190._16_8_ = uStack_5b0;
              auVar190._24_8_ = uStack_5a8;
              auVar194 = vpcmpeqd_avx(auVar207,auVar207);
              auVar222 = ZEXT1664(auVar194);
            }
            else {
              auVar82._4_4_ = auVar213._4_4_ * auVar188._4_4_;
              auVar82._0_4_ = auVar213._0_4_ * auVar188._0_4_;
              auVar82._8_4_ = auVar213._8_4_ * auVar188._8_4_;
              auVar82._12_4_ = auVar213._12_4_ * auVar188._12_4_;
              auVar82._16_4_ = auVar213._16_4_ * auVar188._16_4_;
              auVar82._20_4_ = auVar213._20_4_ * auVar188._20_4_;
              auVar82._24_4_ = auVar213._24_4_ * auVar188._24_4_;
              auVar82._28_4_ = auVar133._28_4_;
              auVar10 = vfmsub231ps_fma(auVar82,auVar177,auVar127);
              auVar206._0_4_ = auVar127._0_4_ * auVar149._0_4_;
              auVar206._4_4_ = auVar127._4_4_ * auVar149._4_4_;
              auVar206._8_4_ = auVar127._8_4_ * auVar149._8_4_;
              auVar206._12_4_ = auVar127._12_4_ * auVar149._12_4_;
              auVar206._16_4_ = auVar127._16_4_ * auVar149._16_4_;
              auVar206._20_4_ = auVar127._20_4_ * auVar149._20_4_;
              auVar206._24_4_ = auVar127._24_4_ * auVar149._24_4_;
              auVar206._28_4_ = 0;
              auVar9 = vfmsub231ps_fma(auVar206,auVar221,auVar188);
              auVar83._4_4_ = auVar221._4_4_ * auVar177._4_4_;
              auVar83._0_4_ = auVar221._0_4_ * auVar177._0_4_;
              auVar83._8_4_ = auVar221._8_4_ * auVar177._8_4_;
              auVar83._12_4_ = auVar221._12_4_ * auVar177._12_4_;
              auVar83._16_4_ = auVar221._16_4_ * auVar177._16_4_;
              auVar83._20_4_ = auVar221._20_4_ * auVar177._20_4_;
              auVar83._24_4_ = auVar221._24_4_ * auVar177._24_4_;
              auVar83._28_4_ = auVar177._28_4_;
              auVar11 = vfmsub231ps_fma(auVar83,auVar149,auVar213);
              auVar187 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar9),ZEXT1632(auVar11));
              auVar207 = vfmadd231ps_fma(ZEXT1632(auVar187),ZEXT1632(auVar10),auVar135);
              auVar133 = vrcpps_avx(ZEXT1632(auVar207));
              auVar234._8_4_ = 0x3f800000;
              auVar234._0_8_ = &DAT_3f8000003f800000;
              auVar234._12_4_ = 0x3f800000;
              auVar234._16_4_ = 0x3f800000;
              auVar234._20_4_ = 0x3f800000;
              auVar234._24_4_ = 0x3f800000;
              auVar234._28_4_ = 0x3f800000;
              auVar187 = vfnmadd213ps_fma(auVar133,ZEXT1632(auVar207),auVar234);
              auVar187 = vfmadd132ps_fma(ZEXT1632(auVar187),auVar133,auVar133);
              auVar84._4_4_ = auVar11._4_4_ * local_720._4_4_;
              auVar84._0_4_ = auVar11._0_4_ * local_720._0_4_;
              auVar84._8_4_ = auVar11._8_4_ * local_720._8_4_;
              auVar84._12_4_ = auVar11._12_4_ * local_720._12_4_;
              auVar84._16_4_ = local_720._16_4_ * 0.0;
              auVar84._20_4_ = local_720._20_4_ * 0.0;
              auVar84._24_4_ = local_720._24_4_ * 0.0;
              auVar84._28_4_ = auVar20._28_4_;
              auVar9 = vfmadd231ps_fma(auVar84,ZEXT1632(auVar9),auVar20);
              auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar10),auVar147);
              fVar164 = auVar187._0_4_;
              fVar163 = auVar187._4_4_;
              fVar138 = auVar187._8_4_;
              fVar139 = auVar187._12_4_;
              auVar135 = ZEXT1632(CONCAT412(fVar139 * auVar9._12_4_,
                                            CONCAT48(fVar138 * auVar9._8_4_,
                                                     CONCAT44(fVar163 * auVar9._4_4_,
                                                              fVar164 * auVar9._0_4_))));
              uVar123 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar189._4_4_ = uVar123;
              auVar189._0_4_ = uVar123;
              auVar189._8_4_ = uVar123;
              auVar189._12_4_ = uVar123;
              auVar189._16_4_ = uVar123;
              auVar189._20_4_ = uVar123;
              auVar189._24_4_ = uVar123;
              auVar189._28_4_ = uVar123;
              auVar112._4_4_ = uStack_19c;
              auVar112._0_4_ = local_1a0;
              auVar112._8_4_ = uStack_198;
              auVar112._12_4_ = uStack_194;
              auVar112._16_4_ = uStack_190;
              auVar112._20_4_ = uStack_18c;
              auVar112._24_4_ = uStack_188;
              auVar112._28_4_ = uStack_184;
              auVar20 = vcmpps_avx(auVar112,auVar135,2);
              auVar133 = vcmpps_avx(auVar135,auVar189,2);
              auVar20 = vandps_avx(auVar133,auVar20);
              auVar187 = vpackssdw_avx(auVar20._0_16_,auVar20._16_16_);
              auVar194 = vpand_avx(auVar194,auVar187);
              auVar20 = vpmovsxwd_avx2(auVar194);
              if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar20 >> 0x7f,0) == '\0') &&
                    (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar20 >> 0xbf,0) == '\0') &&
                  (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar20[0x1f]) goto LAB_01964e6a;
              auVar20 = vcmpps_avx(ZEXT1632(auVar207),ZEXT832(0) << 0x20,4);
              auVar207 = auVar20._16_16_;
              auVar187 = vpackssdw_avx(auVar20._0_16_,auVar207);
              auVar194 = vpand_avx(auVar194,auVar187);
              auVar20 = vpmovsxwd_avx2(auVar194);
              auVar190._8_8_ = uStack_5b8;
              auVar190._0_8_ = local_5c0;
              auVar190._16_8_ = uStack_5b0;
              auVar190._24_8_ = uStack_5a8;
              auVar194 = vpcmpeqd_avx(auVar207,auVar207);
              auVar222 = ZEXT1664(auVar194);
              if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar20 >> 0x7f,0) != '\0') ||
                    (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar20 >> 0xbf,0) != '\0') ||
                  (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar20[0x1f] < '\0') {
                auVar181 = ZEXT1632(CONCAT412(fVar139 * auVar6._12_4_,
                                              CONCAT48(fVar138 * auVar6._8_4_,
                                                       CONCAT44(fVar163 * auVar6._4_4_,
                                                                fVar164 * auVar6._0_4_))));
                auVar85._28_4_ = SUB84(uStack_5a8,4);
                auVar85._0_28_ =
                     ZEXT1628(CONCAT412(fVar139 * auVar7._12_4_,
                                        CONCAT48(fVar138 * auVar7._8_4_,
                                                 CONCAT44(fVar163 * auVar7._4_4_,
                                                          fVar164 * auVar7._0_4_))));
                auVar214._8_4_ = 0x3f800000;
                auVar214._0_8_ = &DAT_3f8000003f800000;
                auVar214._12_4_ = 0x3f800000;
                auVar214._16_4_ = 0x3f800000;
                auVar214._20_4_ = 0x3f800000;
                auVar214._24_4_ = 0x3f800000;
                auVar214._28_4_ = 0x3f800000;
                auVar133 = vsubps_avx(auVar214,auVar181);
                local_160 = vblendvps_avx(auVar133,auVar181,auVar21);
                auVar133 = vsubps_avx(auVar214,auVar85);
                local_280 = vblendvps_avx(auVar133,auVar85,auVar21);
                auVar183 = ZEXT3264(local_280);
                auVar190 = auVar20;
                local_500 = auVar135;
              }
            }
            auVar255 = ZEXT3264(local_840);
            auVar246 = ZEXT3264(local_800);
            local_580 = auVar156;
            if ((((((((auVar190 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar190 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar190 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar190 >> 0x7f,0) == '\0') &&
                  (auVar190 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar190 >> 0xbf,0) == '\0') &&
                (auVar190 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar190[0x1f]) goto LAB_01964b20;
            auVar20 = vsubps_avx(local_4e0,auVar156);
            auVar194 = vfmadd213ps_fma(auVar20,local_160,auVar156);
            fVar164 = *(float *)((long)local_868->ray_space + k * 4 + -0x10);
            auVar86._4_4_ = (auVar194._4_4_ + auVar194._4_4_) * fVar164;
            auVar86._0_4_ = (auVar194._0_4_ + auVar194._0_4_) * fVar164;
            auVar86._8_4_ = (auVar194._8_4_ + auVar194._8_4_) * fVar164;
            auVar86._12_4_ = (auVar194._12_4_ + auVar194._12_4_) * fVar164;
            auVar86._16_4_ = fVar164 * 0.0;
            auVar86._20_4_ = fVar164 * 0.0;
            auVar86._24_4_ = fVar164 * 0.0;
            auVar86._28_4_ = fVar164;
            auVar20 = vcmpps_avx(local_500,auVar86,6);
            auVar133 = auVar190 & auVar20;
            auVar215 = ZEXT3264(local_7e0);
            if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar133 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar133 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar133 >> 0x7f,0) != '\0') ||
                  (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar133 >> 0xbf,0) != '\0') ||
                (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar133[0x1f] < '\0') {
              local_300 = vandps_avx(auVar20,auVar190);
              auVar157._8_4_ = 0xbf800000;
              auVar157._0_8_ = 0xbf800000bf800000;
              auVar157._12_4_ = 0xbf800000;
              auVar157._16_4_ = 0xbf800000;
              auVar157._20_4_ = 0xbf800000;
              auVar157._24_4_ = 0xbf800000;
              auVar157._28_4_ = 0xbf800000;
              auVar182._8_4_ = 0x40000000;
              auVar182._0_8_ = 0x4000000040000000;
              auVar182._12_4_ = 0x40000000;
              auVar182._16_4_ = 0x40000000;
              auVar182._20_4_ = 0x40000000;
              auVar182._24_4_ = 0x40000000;
              auVar182._28_4_ = 0x40000000;
              auVar183 = ZEXT3264(auVar182);
              auVar194 = vfmadd213ps_fma(local_280,auVar182,auVar157);
              local_3c0 = local_160;
              local_280 = ZEXT1632(auVar194);
              auVar20 = local_280;
              local_3a0 = ZEXT1632(auVar194);
              local_380 = local_500;
              local_35c = iVar15;
              local_350 = local_890;
              uStack_348 = uStack_888;
              local_340 = local_740._0_8_;
              uStack_338 = local_740._8_8_;
              local_330 = local_750._0_8_;
              uStack_328 = local_750._8_8_;
              local_320 = local_760;
              uStack_318 = uStack_758;
              pGVar122 = (context->scene->geometries).items[uVar13].ptr;
              local_280 = auVar20;
              if ((pGVar122->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                auVar242 = ZEXT864(0);
                fVar164 = (float)local_360;
                local_2e0[0] = (fVar164 + local_160._0_4_ + 0.0) * local_1c0;
                local_2e0[1] = (fVar164 + local_160._4_4_ + 1.0) * fStack_1bc;
                local_2e0[2] = (fVar164 + local_160._8_4_ + 2.0) * fStack_1b8;
                local_2e0[3] = (fVar164 + local_160._12_4_ + 3.0) * fStack_1b4;
                fStack_2d0 = (fVar164 + local_160._16_4_ + 4.0) * fStack_1b0;
                fStack_2cc = (fVar164 + local_160._20_4_ + 5.0) * fStack_1ac;
                fStack_2c8 = (fVar164 + local_160._24_4_ + 6.0) * fStack_1a8;
                fStack_2c4 = fVar164 + local_160._28_4_ + 7.0;
                local_280._0_8_ = auVar194._0_8_;
                local_280._8_8_ = auVar194._8_8_;
                local_2c0 = local_280._0_8_;
                uStack_2b8 = local_280._8_8_;
                uStack_2b0 = 0;
                uStack_2a8 = 0;
                local_2a0 = local_500;
                auVar158._8_4_ = 0x7f800000;
                auVar158._0_8_ = 0x7f8000007f800000;
                auVar158._12_4_ = 0x7f800000;
                auVar158._16_4_ = 0x7f800000;
                auVar158._20_4_ = 0x7f800000;
                auVar158._24_4_ = 0x7f800000;
                auVar158._28_4_ = 0x7f800000;
                auVar20 = vblendvps_avx(auVar158,local_500,local_300);
                auVar133 = vshufps_avx(auVar20,auVar20,0xb1);
                auVar133 = vminps_avx(auVar20,auVar133);
                auVar135 = vshufpd_avx(auVar133,auVar133,5);
                auVar133 = vminps_avx(auVar133,auVar135);
                auVar135 = vpermpd_avx2(auVar133,0x4e);
                auVar133 = vminps_avx(auVar133,auVar135);
                auVar133 = vcmpps_avx(auVar20,auVar133,0);
                auVar135 = local_300 & auVar133;
                auVar20 = local_300;
                if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar135 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar135 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar135 >> 0x7f,0) != '\0') ||
                      (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar135 >> 0xbf,0) != '\0') ||
                    (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar135[0x1f] < '\0') {
                  auVar20 = vandps_avx(auVar133,local_300);
                }
                uVar116 = vmovmskps_avx(auVar20);
                uVar118 = 0;
                for (; (uVar116 & 1) == 0; uVar116 = uVar116 >> 1 | 0x80000000) {
                  uVar118 = uVar118 + 1;
                }
                uVar117 = (ulong)uVar118;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar122->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar164 = local_2e0[uVar117];
                  uVar123 = *(undefined4 *)((long)&local_2c0 + uVar117 * 4);
                  fVar163 = 1.0 - fVar164;
                  auVar194 = ZEXT416((uint)(fVar164 * fVar163 * 4.0));
                  auVar187 = vfnmsub213ss_fma(ZEXT416((uint)fVar164),ZEXT416((uint)fVar164),auVar194
                                             );
                  auVar194 = vfmadd213ss_fma(ZEXT416((uint)fVar163),ZEXT416((uint)fVar163),auVar194)
                  ;
                  fVar163 = fVar163 * -fVar163 * 0.5;
                  fVar138 = auVar187._0_4_ * 0.5;
                  fVar139 = auVar194._0_4_ * 0.5;
                  fVar140 = fVar164 * fVar164 * 0.5;
                  auVar195._0_4_ = fVar140 * (float)local_760._0_4_;
                  auVar195._4_4_ = fVar140 * (float)local_760._4_4_;
                  auVar195._8_4_ = fVar140 * (float)uStack_758;
                  auVar195._12_4_ = fVar140 * uStack_758._4_4_;
                  auVar171._4_4_ = fVar139;
                  auVar171._0_4_ = fVar139;
                  auVar171._8_4_ = fVar139;
                  auVar171._12_4_ = fVar139;
                  auVar194 = vfmadd132ps_fma(auVar171,auVar195,local_750);
                  auVar196._4_4_ = fVar138;
                  auVar196._0_4_ = fVar138;
                  auVar196._8_4_ = fVar138;
                  auVar196._12_4_ = fVar138;
                  auVar194 = vfmadd132ps_fma(auVar196,auVar194,local_740);
                  auVar172._4_4_ = fVar163;
                  auVar172._0_4_ = fVar163;
                  auVar172._8_4_ = fVar163;
                  auVar172._12_4_ = fVar163;
                  auVar194 = vfmadd132ps_fma(auVar172,auVar194,auVar8);
                  auVar183 = ZEXT1664(auVar194);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2a0 + uVar117 * 4);
                  *(int *)(ray + k * 4 + 0xc0) = auVar194._0_4_;
                  uVar165 = vextractps_avx(auVar194,1);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar165;
                  uVar165 = vextractps_avx(auVar194,2);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar165;
                  *(float *)(ray + k * 4 + 0xf0) = fVar164;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar123;
                  *(uint *)(ray + k * 4 + 0x110) = uVar14;
                  *(uint *)(ray + k * 4 + 0x120) = uVar13;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_860._16_16_ = auVar147._16_16_;
                  local_860._0_16_ = local_740;
                  local_720._0_16_ = local_750;
                  _local_6a0 = ZEXT1632(_local_760);
                  local_6c0 = ZEXT1632(*local_728);
                  local_660._8_24_ = auVar19._8_24_;
                  local_660._0_8_ = pGVar122;
                  local_600 = local_300;
                  _local_540 = *pauVar2;
                  do {
                    uVar123 = *(undefined4 *)(ray + k * 4 + 0x80);
                    fVar164 = local_2e0[uVar117];
                    local_420._4_4_ = fVar164;
                    local_420._0_4_ = fVar164;
                    local_420._8_4_ = fVar164;
                    local_420._12_4_ = fVar164;
                    local_410._4_4_ = *(undefined4 *)((long)&local_2c0 + uVar117 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2a0 + uVar117 * 4);
                    fVar138 = 1.0 - fVar164;
                    auVar194 = ZEXT416((uint)(fVar164 * fVar138 * 4.0));
                    auVar187 = vfnmsub213ss_fma(local_420,local_420,auVar194);
                    auVar194 = vfmadd213ss_fma(ZEXT416((uint)fVar138),ZEXT416((uint)fVar138),
                                               auVar194);
                    fVar163 = auVar194._0_4_ * 0.5;
                    fVar164 = fVar164 * fVar164 * 0.5;
                    auVar197._0_4_ = fVar164 * (float)local_6a0._0_4_;
                    auVar197._4_4_ = fVar164 * (float)local_6a0._4_4_;
                    auVar197._8_4_ = fVar164 * fStack_698;
                    auVar197._12_4_ = fVar164 * fStack_694;
                    auVar173._4_4_ = fVar163;
                    auVar173._0_4_ = fVar163;
                    auVar173._8_4_ = fVar163;
                    auVar173._12_4_ = fVar163;
                    auVar194 = vfmadd132ps_fma(auVar173,auVar197,local_720._0_16_);
                    fVar164 = auVar187._0_4_ * 0.5;
                    auVar198._4_4_ = fVar164;
                    auVar198._0_4_ = fVar164;
                    auVar198._8_4_ = fVar164;
                    auVar198._12_4_ = fVar164;
                    auVar194 = vfmadd132ps_fma(auVar198,auVar194,local_860._0_16_);
                    local_7b0.context = context->user;
                    fVar164 = fVar138 * -fVar138 * 0.5;
                    auVar174._4_4_ = fVar164;
                    auVar174._0_4_ = fVar164;
                    auVar174._8_4_ = fVar164;
                    auVar174._12_4_ = fVar164;
                    auVar194 = vfmadd132ps_fma(auVar174,auVar194,auVar8);
                    uVar165 = auVar194._0_4_;
                    local_450[0] = (RTCHitN)(char)uVar165;
                    local_450[1] = (RTCHitN)(char)((uint)uVar165 >> 8);
                    local_450[2] = (RTCHitN)(char)((uint)uVar165 >> 0x10);
                    local_450[3] = (RTCHitN)(char)((uint)uVar165 >> 0x18);
                    local_450[4] = (RTCHitN)(char)uVar165;
                    local_450[5] = (RTCHitN)(char)((uint)uVar165 >> 8);
                    local_450[6] = (RTCHitN)(char)((uint)uVar165 >> 0x10);
                    local_450[7] = (RTCHitN)(char)((uint)uVar165 >> 0x18);
                    local_450[8] = (RTCHitN)(char)uVar165;
                    local_450[9] = (RTCHitN)(char)((uint)uVar165 >> 8);
                    local_450[10] = (RTCHitN)(char)((uint)uVar165 >> 0x10);
                    local_450[0xb] = (RTCHitN)(char)((uint)uVar165 >> 0x18);
                    local_450[0xc] = (RTCHitN)(char)uVar165;
                    local_450[0xd] = (RTCHitN)(char)((uint)uVar165 >> 8);
                    local_450[0xe] = (RTCHitN)(char)((uint)uVar165 >> 0x10);
                    local_450[0xf] = (RTCHitN)(char)((uint)uVar165 >> 0x18);
                    local_440 = vshufps_avx(auVar194,auVar194,0x55);
                    local_430 = vshufps_avx(auVar194,auVar194,0xaa);
                    local_410._0_4_ = local_410._4_4_;
                    local_410._8_4_ = local_410._4_4_;
                    local_410._12_4_ = local_410._4_4_;
                    local_400 = CONCAT44(uStack_20c,local_210);
                    uStack_3f8 = CONCAT44(uStack_204,uStack_208);
                    local_3f0._4_4_ = uStack_1fc;
                    local_3f0._0_4_ = local_200;
                    local_3f0._8_4_ = uStack_1f8;
                    local_3f0._12_4_ = uStack_1f4;
                    vpcmpeqd_avx2(ZEXT1632(local_3f0),ZEXT1632(local_3f0));
                    uStack_3dc = (local_7b0.context)->instID[0];
                    local_3e0 = uStack_3dc;
                    uStack_3d8 = uStack_3dc;
                    uStack_3d4 = uStack_3dc;
                    uStack_3d0 = (local_7b0.context)->instPrimID[0];
                    uStack_3cc = uStack_3d0;
                    uStack_3c8 = uStack_3d0;
                    uStack_3c4 = uStack_3d0;
                    local_880 = local_6c0._0_8_;
                    uStack_878 = local_6c0._8_8_;
                    local_7b0.valid = (int *)&local_880;
                    local_7b0.geometryUserPtr = pGVar122->userPtr;
                    local_7b0.hit = local_450;
                    local_7b0.N = 4;
                    local_7b0.ray = (RTCRayN *)ray;
                    if (pGVar122->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar194 = auVar222._0_16_;
                      auVar242 = ZEXT1664(auVar242._0_16_);
                      (*pGVar122->intersectionFilterN)(&local_7b0);
                      auVar215 = ZEXT3264(local_7e0);
                      auVar255 = ZEXT3264(local_840);
                      auVar246 = ZEXT3264(local_800);
                      auVar194 = vpcmpeqd_avx(auVar194,auVar194);
                      auVar222 = ZEXT1664(auVar194);
                      pGVar122 = (Geometry *)local_660._0_8_;
                      fVar230 = local_780;
                      fVar161 = fStack_77c;
                      fVar244 = fStack_778;
                      fVar247 = fStack_774;
                      fVar248 = fStack_770;
                      fVar249 = fStack_76c;
                      fVar250 = fStack_768;
                      fVar162 = (float)local_820;
                      fVar184 = local_820._4_4_;
                      fVar251 = (float)uStack_818;
                      fVar252 = uStack_818._4_4_;
                      fVar226 = (float)uStack_810;
                      fVar227 = uStack_810._4_4_;
                      fVar228 = (float)uStack_808;
                      fVar229 = uStack_808._4_4_;
                    }
                    auVar108._8_8_ = uStack_878;
                    auVar108._0_8_ = local_880;
                    auVar194 = auVar222._0_16_;
                    if (auVar108 == (undefined1  [16])0x0) {
                      auVar187 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar194 = auVar194 ^ auVar187;
                    }
                    else {
                      p_Var18 = context->args->filter;
                      if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar122->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar242 = ZEXT1664(auVar242._0_16_);
                        (*p_Var18)(&local_7b0);
                        auVar215 = ZEXT3264(local_7e0);
                        auVar255 = ZEXT3264(local_840);
                        auVar246 = ZEXT3264(local_800);
                        auVar194 = vpcmpeqd_avx(auVar194,auVar194);
                        auVar222 = ZEXT1664(auVar194);
                        pGVar122 = (Geometry *)local_660._0_8_;
                        fVar230 = local_780;
                        fVar161 = fStack_77c;
                        fVar244 = fStack_778;
                        fVar247 = fStack_774;
                        fVar248 = fStack_770;
                        fVar249 = fStack_76c;
                        fVar250 = fStack_768;
                        fVar162 = (float)local_820;
                        fVar184 = local_820._4_4_;
                        fVar251 = (float)uStack_818;
                        fVar252 = uStack_818._4_4_;
                        fVar226 = (float)uStack_810;
                        fVar227 = uStack_810._4_4_;
                        fVar228 = (float)uStack_808;
                        fVar229 = uStack_808._4_4_;
                      }
                      auVar109._8_8_ = uStack_878;
                      auVar109._0_8_ = local_880;
                      auVar187 = vpcmpeqd_avx(auVar109,_DAT_01feba10);
                      auVar194 = auVar222._0_16_ ^ auVar187;
                      if (auVar109 != (undefined1  [16])0x0) {
                        auVar187 = auVar222._0_16_ ^ auVar187;
                        auVar6 = vmaskmovps_avx(auVar187,*(undefined1 (*) [16])local_7b0.hit);
                        *(undefined1 (*) [16])(local_7b0.ray + 0xc0) = auVar6;
                        auVar6 = vmaskmovps_avx(auVar187,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x10));
                        *(undefined1 (*) [16])(local_7b0.ray + 0xd0) = auVar6;
                        auVar6 = vmaskmovps_avx(auVar187,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x20));
                        *(undefined1 (*) [16])(local_7b0.ray + 0xe0) = auVar6;
                        auVar6 = vmaskmovps_avx(auVar187,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x30));
                        *(undefined1 (*) [16])(local_7b0.ray + 0xf0) = auVar6;
                        auVar6 = vmaskmovps_avx(auVar187,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x40));
                        *(undefined1 (*) [16])(local_7b0.ray + 0x100) = auVar6;
                        auVar6 = vmaskmovps_avx(auVar187,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x50));
                        *(undefined1 (*) [16])(local_7b0.ray + 0x110) = auVar6;
                        auVar6 = vmaskmovps_avx(auVar187,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x60));
                        *(undefined1 (*) [16])(local_7b0.ray + 0x120) = auVar6;
                        auVar6 = vmaskmovps_avx(auVar187,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x70));
                        *(undefined1 (*) [16])(local_7b0.ray + 0x130) = auVar6;
                        auVar187 = vmaskmovps_avx(auVar187,*(undefined1 (*) [16])
                                                            (local_7b0.hit + 0x80));
                        *(undefined1 (*) [16])(local_7b0.ray + 0x140) = auVar187;
                      }
                    }
                    auVar147 = local_500;
                    auVar144._8_8_ = 0x100000001;
                    auVar144._0_8_ = 0x100000001;
                    if ((auVar144 & auVar194) == (undefined1  [16])0x0) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar123;
                    }
                    *(undefined4 *)(local_600 + uVar117 * 4) = 0;
                    uVar123 = *(undefined4 *)(ray + k * 4 + 0x80);
                    auVar136._4_4_ = uVar123;
                    auVar136._0_4_ = uVar123;
                    auVar136._8_4_ = uVar123;
                    auVar136._12_4_ = uVar123;
                    auVar136._16_4_ = uVar123;
                    auVar136._20_4_ = uVar123;
                    auVar136._24_4_ = uVar123;
                    auVar136._28_4_ = uVar123;
                    auVar133 = vcmpps_avx(auVar147,auVar136,2);
                    auVar20 = vandps_avx(auVar133,local_600);
                    auVar133 = local_600 & auVar133;
                    bVar95 = (auVar133 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar96 = (auVar133 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar94 = (auVar133 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0;
                    bVar93 = SUB321(auVar133 >> 0x7f,0) != '\0';
                    bVar92 = (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar91 = SUB321(auVar133 >> 0xbf,0) != '\0';
                    bVar89 = (auVar133 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0;
                    bVar87 = auVar133[0x1f] < '\0';
                    if (((((((bVar95 || bVar96) || bVar94) || bVar93) || bVar92) || bVar91) ||
                        bVar89) || bVar87) {
                      auVar159._8_4_ = 0x7f800000;
                      auVar159._0_8_ = 0x7f8000007f800000;
                      auVar159._12_4_ = 0x7f800000;
                      auVar159._16_4_ = 0x7f800000;
                      auVar159._20_4_ = 0x7f800000;
                      auVar159._24_4_ = 0x7f800000;
                      auVar159._28_4_ = 0x7f800000;
                      auVar147 = vblendvps_avx(auVar159,auVar147,auVar20);
                      auVar133 = vshufps_avx(auVar147,auVar147,0xb1);
                      auVar133 = vminps_avx(auVar147,auVar133);
                      auVar135 = vshufpd_avx(auVar133,auVar133,5);
                      auVar133 = vminps_avx(auVar133,auVar135);
                      auVar135 = vpermpd_avx2(auVar133,0x4e);
                      local_600 = vminps_avx(auVar133,auVar135);
                      auVar133 = vcmpps_avx(auVar147,local_600,0);
                      auVar135 = auVar20 & auVar133;
                      auVar147 = auVar20;
                      if ((((((((auVar135 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar135 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar135 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar135 >> 0x7f,0) != '\0') ||
                            (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar135 >> 0xbf,0) != '\0') ||
                          (auVar135 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar135[0x1f] < '\0') {
                        auVar147 = vandps_avx(auVar133,auVar20);
                      }
                      uVar116 = vmovmskps_avx(auVar147);
                      uVar118 = 0;
                      for (; (uVar116 & 1) == 0; uVar116 = uVar116 >> 1 | 0x80000000) {
                        uVar118 = uVar118 + 1;
                      }
                      uVar117 = (ulong)uVar118;
                    }
                    auVar183 = ZEXT3264(local_600);
                    local_600 = auVar20;
                  } while (((((((bVar95 || bVar96) || bVar94) || bVar93) || bVar92) || bVar91) ||
                           bVar89) || bVar87);
                }
              }
            }
          }
          lVar120 = lVar120 + 8;
        } while ((int)lVar120 < iVar15);
      }
      uVar123 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar134._4_4_ = uVar123;
      auVar134._0_4_ = uVar123;
      auVar134._8_4_ = uVar123;
      auVar134._12_4_ = uVar123;
      auVar134._16_4_ = uVar123;
      auVar134._20_4_ = uVar123;
      auVar134._24_4_ = uVar123;
      auVar134._28_4_ = uVar123;
      auVar147 = vcmpps_avx(local_80,auVar134,2);
      uVar118 = vmovmskps_avx(auVar147);
      uVar115 = uVar115 & uVar115 + 0xff & uVar118;
    } while (uVar115 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }